

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int **ppiVar1;
  int **ppiVar2;
  int **ppiVar3;
  int **ppiVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined6 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  int iVar43;
  undefined4 uVar44;
  ulong uVar45;
  long lVar46;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long extraout_RAX_02;
  RayK<4> *pRVar47;
  long extraout_RAX_03;
  long extraout_RAX_04;
  long extraout_RAX_05;
  long extraout_RAX_06;
  RTCFilterFunctionN p_Var48;
  ulong uVar49;
  ulong uVar50;
  byte unaff_BPL;
  int iVar51;
  undefined4 uVar52;
  RTCFilterFunctionN p_Var53;
  RTCFilterFunctionNArguments *pRVar54;
  byte bVar55;
  ulong uVar56;
  long lVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  short sVar66;
  float fVar67;
  float fVar68;
  float fVar113;
  float fVar115;
  __m128 a_1;
  undefined2 uVar112;
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  float fVar114;
  float fVar116;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined8 uVar117;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar118;
  float fVar139;
  float fVar140;
  vfloat4 a;
  undefined1 auVar119 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar141;
  float fVar155;
  float fVar156;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar157;
  float fVar169;
  float fVar170;
  vfloat_impl<4> t;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar171;
  float fVar189;
  float fVar190;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar191;
  float fVar200;
  float fVar201;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar202;
  float fVar212;
  float fVar213;
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar236;
  float fVar237;
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  float fVar238;
  float fVar246;
  float fVar247;
  undefined1 auVar239 [16];
  float fVar248;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float t_1;
  float fVar249;
  float fVar253;
  float fVar254;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar255;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar268;
  float fVar274;
  float fVar276;
  undefined1 auVar269 [16];
  float fVar279;
  undefined1 auVar272 [16];
  float fVar275;
  float fVar277;
  float fVar278;
  float fVar280;
  float fVar281;
  undefined1 auVar273 [16];
  float fVar282;
  float fVar283;
  float fVar286;
  float fVar288;
  float fVar290;
  undefined1 auVar284 [16];
  float fVar287;
  float fVar289;
  float fVar291;
  undefined1 auVar285 [16];
  float fVar292;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float s;
  float fVar298;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx u_outer1;
  vfloatx u_outer0;
  vboolx valid;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  bool local_6a9;
  undefined8 local_638;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  undefined8 local_578;
  undefined8 uStack_570;
  ulong local_568;
  RTCFilterFunctionNArguments *local_560;
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  undefined8 uStack_4f0;
  RTCRayQueryContext *local_4e8;
  RayK<4> *local_4e0;
  RTCHitN *local_4d8;
  uint local_4d0;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [16];
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  undefined4 uStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined8 *local_418;
  ulong local_410;
  undefined1 local_408 [16];
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_378 [16];
  float local_368 [4];
  float local_358 [6];
  Primitive *local_340;
  uint local_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  undefined1 local_318 [16];
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint local_f8 [4];
  float afStack_e8 [4];
  float local_d8 [42];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 uVar111;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar232 [16];
  undefined1 auVar234 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  
  PVar6 = prim[1];
  uVar45 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar45 * 0x19 + 6;
  fVar156 = *(float *)(pPVar5 + 0xc);
  fVar171 = (*(float *)(ray + k * 4) - *(float *)pPVar5) * fVar156;
  fVar189 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar5 + 4)) * fVar156;
  fVar190 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar5 + 8)) * fVar156;
  fVar141 = *(float *)(ray + k * 4 + 0x40) * fVar156;
  fVar155 = *(float *)(ray + k * 4 + 0x50) * fVar156;
  fVar156 = *(float *)(ray + k * 4 + 0x60) * fVar156;
  uVar52 = *(undefined4 *)(prim + uVar45 * 4 + 6);
  uVar111 = (undefined1)((uint)uVar52 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar52 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar52));
  uVar111 = (undefined1)((uint)uVar52 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar66 = CONCAT11((char)uVar52,(char)uVar52);
  uVar56 = CONCAT62(uVar27,sVar66);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar56;
  auVar195._12_2_ = uVar112;
  auVar195._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar56;
  auVar194._10_2_ = uVar112;
  auVar77._10_6_ = auVar194._10_6_;
  auVar77._8_2_ = uVar112;
  auVar77._0_8_ = uVar56;
  uVar112 = (undefined2)uVar27;
  auVar28._4_8_ = auVar77._8_8_;
  auVar28._2_2_ = uVar112;
  auVar28._0_2_ = uVar112;
  fVar118 = (float)((int)sVar66 >> 8);
  fVar139 = (float)(auVar28._0_4_ >> 0x18);
  fVar140 = (float)(auVar77._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar45 * 5 + 6);
  uVar111 = (undefined1)((uint)uVar52 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar52 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar52));
  uVar111 = (undefined1)((uint)uVar52 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar66 = CONCAT11((char)uVar52,(char)uVar52);
  uVar56 = CONCAT62(uVar27,sVar66);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar56;
  auVar70._12_2_ = uVar112;
  auVar70._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar56;
  auVar69._10_2_ = uVar112;
  auVar300._10_6_ = auVar69._10_6_;
  auVar300._8_2_ = uVar112;
  auVar300._0_8_ = uVar56;
  uVar112 = (undefined2)uVar27;
  auVar29._4_8_ = auVar300._8_8_;
  auVar29._2_2_ = uVar112;
  auVar29._0_2_ = uVar112;
  fVar191 = (float)((int)sVar66 >> 8);
  fVar200 = (float)(auVar29._0_4_ >> 0x18);
  fVar201 = (float)(auVar300._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar45 * 6 + 6);
  uVar111 = (undefined1)((uint)uVar52 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar52 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar52));
  uVar111 = (undefined1)((uint)uVar52 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar66 = CONCAT11((char)uVar52,(char)uVar52);
  uVar56 = CONCAT62(uVar27,sVar66);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar56;
  auVar73._12_2_ = uVar112;
  auVar73._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar56;
  auVar72._10_2_ = uVar112;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar112;
  auVar71._0_8_ = uVar56;
  uVar112 = (undefined2)uVar27;
  auVar30._4_8_ = auVar71._8_8_;
  auVar30._2_2_ = uVar112;
  auVar30._0_2_ = uVar112;
  fVar157 = (float)((int)sVar66 >> 8);
  fVar169 = (float)(auVar30._0_4_ >> 0x18);
  fVar170 = (float)(auVar71._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar45 * 0xb + 6);
  uVar111 = (undefined1)((uint)uVar52 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar52 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar52));
  uVar111 = (undefined1)((uint)uVar52 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar66 = CONCAT11((char)uVar52,(char)uVar52);
  uVar56 = CONCAT62(uVar27,sVar66);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar56;
  auVar76._12_2_ = uVar112;
  auVar76._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar56;
  auVar75._10_2_ = uVar112;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar112;
  auVar74._0_8_ = uVar56;
  uVar112 = (undefined2)uVar27;
  auVar31._4_8_ = auVar74._8_8_;
  auVar31._2_2_ = uVar112;
  auVar31._0_2_ = uVar112;
  fVar67 = (float)((int)sVar66 >> 8);
  fVar113 = (float)(auVar31._0_4_ >> 0x18);
  fVar115 = (float)(auVar74._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar111 = (undefined1)((uint)uVar52 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar52 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar52));
  uVar111 = (undefined1)((uint)uVar52 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar66 = CONCAT11((char)uVar52,(char)uVar52);
  uVar56 = CONCAT62(uVar27,sVar66);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar56;
  auVar205._12_2_ = uVar112;
  auVar205._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar56;
  auVar204._10_2_ = uVar112;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar112;
  auVar203._0_8_ = uVar56;
  uVar112 = (undefined2)uVar27;
  auVar32._4_8_ = auVar203._8_8_;
  auVar32._2_2_ = uVar112;
  auVar32._0_2_ = uVar112;
  fVar202 = (float)((int)sVar66 >> 8);
  fVar212 = (float)(auVar32._0_4_ >> 0x18);
  fVar213 = (float)(auVar203._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar45 + 6);
  uVar111 = (undefined1)((uint)uVar52 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar52 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar52));
  uVar111 = (undefined1)((uint)uVar52 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar66 = CONCAT11((char)uVar52,(char)uVar52);
  uVar56 = CONCAT62(uVar27,sVar66);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar56;
  auVar217._12_2_ = uVar112;
  auVar217._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar56;
  auVar216._10_2_ = uVar112;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar112;
  auVar215._0_8_ = uVar56;
  uVar112 = (undefined2)uVar27;
  auVar33._4_8_ = auVar215._8_8_;
  auVar33._2_2_ = uVar112;
  auVar33._0_2_ = uVar112;
  fVar249 = (float)((int)sVar66 >> 8);
  fVar253 = (float)(auVar33._0_4_ >> 0x18);
  fVar254 = (float)(auVar215._8_4_ >> 0x18);
  uVar50 = (ulong)(uint)((int)(uVar45 * 9) * 2);
  uVar52 = *(undefined4 *)(prim + uVar50 + 6);
  uVar111 = (undefined1)((uint)uVar52 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar52 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar52));
  uVar111 = (undefined1)((uint)uVar52 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar66 = CONCAT11((char)uVar52,(char)uVar52);
  uVar56 = CONCAT62(uVar27,sVar66);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar56;
  auVar220._12_2_ = uVar112;
  auVar220._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar56;
  auVar219._10_2_ = uVar112;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar112;
  auVar218._0_8_ = uVar56;
  uVar112 = (undefined2)uVar27;
  auVar34._4_8_ = auVar218._8_8_;
  auVar34._2_2_ = uVar112;
  auVar34._0_2_ = uVar112;
  fVar238 = (float)((int)sVar66 >> 8);
  fVar246 = (float)(auVar34._0_4_ >> 0x18);
  fVar247 = (float)(auVar218._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar50 + uVar45 + 6);
  uVar111 = (undefined1)((uint)uVar52 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar52 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar52));
  uVar111 = (undefined1)((uint)uVar52 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar66 = CONCAT11((char)uVar52,(char)uVar52);
  uVar56 = CONCAT62(uVar27,sVar66);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar56;
  auVar223._12_2_ = uVar112;
  auVar223._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar56;
  auVar222._10_2_ = uVar112;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar112;
  auVar221._0_8_ = uVar56;
  uVar112 = (undefined2)uVar27;
  auVar35._4_8_ = auVar221._8_8_;
  auVar35._2_2_ = uVar112;
  auVar35._0_2_ = uVar112;
  fVar255 = (float)((int)sVar66 >> 8);
  fVar263 = (float)(auVar35._0_4_ >> 0x18);
  fVar265 = (float)(auVar221._8_4_ >> 0x18);
  uVar49 = (ulong)(uint)((int)(uVar45 * 5) << 2);
  uVar52 = *(undefined4 *)(prim + uVar49 + 6);
  uVar111 = (undefined1)((uint)uVar52 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar52 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar52));
  uVar111 = (undefined1)((uint)uVar52 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar66 = CONCAT11((char)uVar52,(char)uVar52);
  uVar56 = CONCAT62(uVar27,sVar66);
  auVar271._8_4_ = 0;
  auVar271._0_8_ = uVar56;
  auVar271._12_2_ = uVar112;
  auVar271._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar270._12_4_ = auVar271._12_4_;
  auVar270._8_2_ = 0;
  auVar270._0_8_ = uVar56;
  auVar270._10_2_ = uVar112;
  auVar269._10_6_ = auVar270._10_6_;
  auVar269._8_2_ = uVar112;
  auVar269._0_8_ = uVar56;
  uVar112 = (undefined2)uVar27;
  auVar36._4_8_ = auVar269._8_8_;
  auVar36._2_2_ = uVar112;
  auVar36._0_2_ = uVar112;
  fVar68 = (float)((int)sVar66 >> 8);
  fVar114 = (float)(auVar36._0_4_ >> 0x18);
  fVar116 = (float)(auVar269._8_4_ >> 0x18);
  fVar282 = fVar141 * fVar118 + fVar155 * fVar191 + fVar156 * fVar157;
  fVar286 = fVar141 * fVar139 + fVar155 * fVar200 + fVar156 * fVar169;
  fVar288 = fVar141 * fVar140 + fVar155 * fVar201 + fVar156 * fVar170;
  fVar290 = fVar141 * (float)(auVar194._12_4_ >> 0x18) +
            fVar155 * (float)(auVar69._12_4_ >> 0x18) + fVar156 * (float)(auVar72._12_4_ >> 0x18);
  fVar268 = fVar141 * fVar67 + fVar155 * fVar202 + fVar156 * fVar249;
  fVar274 = fVar141 * fVar113 + fVar155 * fVar212 + fVar156 * fVar253;
  fVar276 = fVar141 * fVar115 + fVar155 * fVar213 + fVar156 * fVar254;
  fVar279 = fVar141 * (float)(auVar75._12_4_ >> 0x18) +
            fVar155 * (float)(auVar204._12_4_ >> 0x18) + fVar156 * (float)(auVar216._12_4_ >> 0x18);
  fVar214 = fVar141 * fVar238 + fVar155 * fVar255 + fVar156 * fVar68;
  fVar236 = fVar141 * fVar246 + fVar155 * fVar263 + fVar156 * fVar114;
  fVar237 = fVar141 * fVar247 + fVar155 * fVar265 + fVar156 * fVar116;
  fVar141 = fVar141 * (float)(auVar219._12_4_ >> 0x18) +
            fVar155 * (float)(auVar222._12_4_ >> 0x18) + fVar156 * (float)(auVar270._12_4_ >> 0x18);
  uVar52 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar157 = fVar118 * fVar171 + fVar191 * fVar189 + fVar157 * fVar190;
  fVar169 = fVar139 * fVar171 + fVar200 * fVar189 + fVar169 * fVar190;
  fVar170 = fVar140 * fVar171 + fVar201 * fVar189 + fVar170 * fVar190;
  fVar191 = (float)(auVar194._12_4_ >> 0x18) * fVar171 +
            (float)(auVar69._12_4_ >> 0x18) * fVar189 + (float)(auVar72._12_4_ >> 0x18) * fVar190;
  fVar249 = fVar67 * fVar171 + fVar202 * fVar189 + fVar249 * fVar190;
  fVar212 = fVar113 * fVar171 + fVar212 * fVar189 + fVar253 * fVar190;
  fVar213 = fVar115 * fVar171 + fVar213 * fVar189 + fVar254 * fVar190;
  fVar253 = (float)(auVar75._12_4_ >> 0x18) * fVar171 +
            (float)(auVar204._12_4_ >> 0x18) * fVar189 + (float)(auVar216._12_4_ >> 0x18) * fVar190;
  fVar200 = fVar171 * fVar238 + fVar189 * fVar255 + fVar190 * fVar68;
  fVar201 = fVar171 * fVar246 + fVar189 * fVar263 + fVar190 * fVar114;
  fVar202 = fVar171 * fVar247 + fVar189 * fVar265 + fVar190 * fVar116;
  fVar171 = fVar171 * (float)(auVar219._12_4_ >> 0x18) +
            fVar189 * (float)(auVar222._12_4_ >> 0x18) + fVar190 * (float)(auVar270._12_4_ >> 0x18);
  fVar156 = (float)DAT_01ff1d40;
  fVar67 = DAT_01ff1d40._4_4_;
  fVar68 = DAT_01ff1d40._8_4_;
  fVar113 = DAT_01ff1d40._12_4_;
  uVar58 = -(uint)(fVar156 <= ABS(fVar282));
  uVar60 = -(uint)(fVar67 <= ABS(fVar286));
  uVar62 = -(uint)(fVar68 <= ABS(fVar288));
  uVar64 = -(uint)(fVar113 <= ABS(fVar290));
  auVar284._0_4_ = (uint)fVar282 & uVar58;
  auVar284._4_4_ = (uint)fVar286 & uVar60;
  auVar284._8_4_ = (uint)fVar288 & uVar62;
  auVar284._12_4_ = (uint)fVar290 & uVar64;
  auVar172._0_4_ = ~uVar58 & (uint)fVar156;
  auVar172._4_4_ = ~uVar60 & (uint)fVar67;
  auVar172._8_4_ = ~uVar62 & (uint)fVar68;
  auVar172._12_4_ = ~uVar64 & (uint)fVar113;
  auVar172 = auVar172 | auVar284;
  uVar58 = -(uint)(fVar156 <= ABS(fVar268));
  uVar60 = -(uint)(fVar67 <= ABS(fVar274));
  uVar62 = -(uint)(fVar68 <= ABS(fVar276));
  uVar64 = -(uint)(fVar113 <= ABS(fVar279));
  auVar272._0_4_ = (uint)fVar268 & uVar58;
  auVar272._4_4_ = (uint)fVar274 & uVar60;
  auVar272._8_4_ = (uint)fVar276 & uVar62;
  auVar272._12_4_ = (uint)fVar279 & uVar64;
  auVar192._0_4_ = ~uVar58 & (uint)fVar156;
  auVar192._4_4_ = ~uVar60 & (uint)fVar67;
  auVar192._8_4_ = ~uVar62 & (uint)fVar68;
  auVar192._12_4_ = ~uVar64 & (uint)fVar113;
  auVar192 = auVar192 | auVar272;
  uVar58 = -(uint)(fVar156 <= ABS(fVar214));
  uVar60 = -(uint)(fVar67 <= ABS(fVar236));
  uVar62 = -(uint)(fVar68 <= ABS(fVar237));
  uVar64 = -(uint)(fVar113 <= ABS(fVar141));
  auVar224._0_4_ = (uint)fVar214 & uVar58;
  auVar224._4_4_ = (uint)fVar236 & uVar60;
  auVar224._8_4_ = (uint)fVar237 & uVar62;
  auVar224._12_4_ = (uint)fVar141 & uVar64;
  auVar206._0_4_ = ~uVar58 & (uint)fVar156;
  auVar206._4_4_ = ~uVar60 & (uint)fVar67;
  auVar206._8_4_ = ~uVar62 & (uint)fVar68;
  auVar206._12_4_ = ~uVar64 & (uint)fVar113;
  auVar206 = auVar206 | auVar224;
  auVar77 = rcpps(_DAT_01ff1d40,auVar172);
  fVar156 = auVar77._0_4_;
  fVar113 = auVar77._4_4_;
  fVar116 = auVar77._8_4_;
  fVar140 = auVar77._12_4_;
  fVar156 = (1.0 - auVar172._0_4_ * fVar156) * fVar156 + fVar156;
  fVar113 = (1.0 - auVar172._4_4_ * fVar113) * fVar113 + fVar113;
  fVar116 = (1.0 - auVar172._8_4_ * fVar116) * fVar116 + fVar116;
  fVar140 = (1.0 - auVar172._12_4_ * fVar140) * fVar140 + fVar140;
  auVar77 = rcpps(auVar77,auVar192);
  fVar67 = auVar77._0_4_;
  fVar114 = auVar77._4_4_;
  fVar118 = auVar77._8_4_;
  fVar141 = auVar77._12_4_;
  fVar67 = (1.0 - auVar192._0_4_ * fVar67) * fVar67 + fVar67;
  fVar114 = (1.0 - auVar192._4_4_ * fVar114) * fVar114 + fVar114;
  fVar118 = (1.0 - auVar192._8_4_ * fVar118) * fVar118 + fVar118;
  fVar141 = (1.0 - auVar192._12_4_ * fVar141) * fVar141 + fVar141;
  auVar77 = rcpps(auVar77,auVar206);
  fVar68 = auVar77._0_4_;
  fVar115 = auVar77._4_4_;
  fVar139 = auVar77._8_4_;
  fVar155 = auVar77._12_4_;
  fVar68 = (1.0 - auVar206._0_4_ * fVar68) * fVar68 + fVar68;
  fVar115 = (1.0 - auVar206._4_4_ * fVar115) * fVar115 + fVar115;
  fVar139 = (1.0 - auVar206._8_4_ * fVar139) * fVar139 + fVar139;
  fVar155 = (1.0 - auVar206._12_4_ * fVar155) * fVar155 + fVar155;
  uVar56 = *(ulong *)(prim + uVar45 * 7 + 6);
  uVar112 = (undefined2)(uVar56 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar56;
  auVar80._12_2_ = uVar112;
  auVar80._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar56 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar56;
  auVar79._10_2_ = uVar112;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar112;
  auVar78._0_8_ = uVar56;
  uVar112 = (undefined2)(uVar56 >> 0x10);
  auVar37._4_8_ = auVar78._8_8_;
  auVar37._2_2_ = uVar112;
  auVar37._0_2_ = uVar112;
  auVar173._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar169) * fVar113,
                ((float)(int)(short)uVar56 - fVar157) * fVar156);
  auVar173._8_4_ = ((float)(auVar78._8_4_ >> 0x10) - fVar170) * fVar116;
  auVar173._12_4_ = ((float)(auVar79._12_4_ >> 0x10) - fVar191) * fVar140;
  uVar56 = *(ulong *)(prim + uVar45 * 9 + 6);
  uVar112 = (undefined2)(uVar56 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar56;
  auVar83._12_2_ = uVar112;
  auVar83._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar56 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar56;
  auVar82._10_2_ = uVar112;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar112;
  auVar81._0_8_ = uVar56;
  uVar112 = (undefined2)(uVar56 >> 0x10);
  auVar38._4_8_ = auVar81._8_8_;
  auVar38._2_2_ = uVar112;
  auVar38._0_2_ = uVar112;
  auVar207._0_4_ = ((float)(int)(short)uVar56 - fVar157) * fVar156;
  auVar207._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar169) * fVar113;
  auVar207._8_4_ = ((float)(auVar81._8_4_ >> 0x10) - fVar170) * fVar116;
  auVar207._12_4_ = ((float)(auVar82._12_4_ >> 0x10) - fVar191) * fVar140;
  uVar56 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar50 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar45 * -2 + 6);
  uVar112 = (undefined2)(uVar50 >> 0x30);
  auVar121._8_4_ = 0;
  auVar121._0_8_ = uVar50;
  auVar121._12_2_ = uVar112;
  auVar121._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar50 >> 0x20);
  auVar120._12_4_ = auVar121._12_4_;
  auVar120._8_2_ = 0;
  auVar120._0_8_ = uVar50;
  auVar120._10_2_ = uVar112;
  auVar119._10_6_ = auVar120._10_6_;
  auVar119._8_2_ = uVar112;
  auVar119._0_8_ = uVar50;
  uVar112 = (undefined2)(uVar50 >> 0x10);
  auVar39._4_8_ = auVar119._8_8_;
  auVar39._2_2_ = uVar112;
  auVar39._0_2_ = uVar112;
  auVar122._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar212) * fVar114,
                ((float)(int)(short)uVar50 - fVar249) * fVar67);
  auVar122._8_4_ = ((float)(auVar119._8_4_ >> 0x10) - fVar213) * fVar118;
  auVar122._12_4_ = ((float)(auVar120._12_4_ >> 0x10) - fVar253) * fVar141;
  uVar112 = (undefined2)(uVar56 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar56;
  auVar86._12_2_ = uVar112;
  auVar86._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar56 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar56;
  auVar85._10_2_ = uVar112;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar112;
  auVar84._0_8_ = uVar56;
  uVar112 = (undefined2)(uVar56 >> 0x10);
  auVar40._4_8_ = auVar84._8_8_;
  auVar40._2_2_ = uVar112;
  auVar40._0_2_ = uVar112;
  auVar239._0_4_ = ((float)(int)(short)uVar56 - fVar249) * fVar67;
  auVar239._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar212) * fVar114;
  auVar239._8_4_ = ((float)(auVar84._8_4_ >> 0x10) - fVar213) * fVar118;
  auVar239._12_4_ = ((float)(auVar85._12_4_ >> 0x10) - fVar253) * fVar141;
  uVar56 = *(ulong *)(prim + uVar49 + uVar45 + 6);
  uVar112 = (undefined2)(uVar56 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar56;
  auVar89._12_2_ = uVar112;
  auVar89._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar56 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar56;
  auVar88._10_2_ = uVar112;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar112;
  auVar87._0_8_ = uVar56;
  uVar112 = (undefined2)(uVar56 >> 0x10);
  auVar41._4_8_ = auVar87._8_8_;
  auVar41._2_2_ = uVar112;
  auVar41._0_2_ = uVar112;
  auVar90._0_8_ =
       CONCAT44(((float)(auVar41._0_4_ >> 0x10) - fVar201) * fVar115,
                ((float)(int)(short)uVar56 - fVar200) * fVar68);
  auVar90._8_4_ = ((float)(auVar87._8_4_ >> 0x10) - fVar202) * fVar139;
  auVar90._12_4_ = ((float)(auVar88._12_4_ >> 0x10) - fVar171) * fVar155;
  uVar56 = *(ulong *)(prim + uVar45 * 0x17 + 6);
  uVar112 = (undefined2)(uVar56 >> 0x30);
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar56;
  auVar227._12_2_ = uVar112;
  auVar227._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar56 >> 0x20);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar56;
  auVar226._10_2_ = uVar112;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = uVar112;
  auVar225._0_8_ = uVar56;
  uVar112 = (undefined2)(uVar56 >> 0x10);
  auVar42._4_8_ = auVar225._8_8_;
  auVar42._2_2_ = uVar112;
  auVar42._0_2_ = uVar112;
  auVar228._0_4_ = ((float)(int)(short)uVar56 - fVar200) * fVar68;
  auVar228._4_4_ = ((float)(auVar42._0_4_ >> 0x10) - fVar201) * fVar115;
  auVar228._8_4_ = ((float)(auVar225._8_4_ >> 0x10) - fVar202) * fVar139;
  auVar228._12_4_ = ((float)(auVar226._12_4_ >> 0x10) - fVar171) * fVar155;
  auVar193._8_4_ = auVar173._8_4_;
  auVar193._0_8_ = auVar173._0_8_;
  auVar193._12_4_ = auVar173._12_4_;
  auVar194 = minps(auVar193,auVar207);
  auVar142._8_4_ = auVar122._8_4_;
  auVar142._0_8_ = auVar122._0_8_;
  auVar142._12_4_ = auVar122._12_4_;
  auVar77 = minps(auVar142,auVar239);
  auVar194 = maxps(auVar194,auVar77);
  auVar143._8_4_ = auVar90._8_4_;
  auVar143._0_8_ = auVar90._0_8_;
  auVar143._12_4_ = auVar90._12_4_;
  auVar77 = minps(auVar143,auVar228);
  auVar158._4_4_ = uVar52;
  auVar158._0_4_ = uVar52;
  auVar158._8_4_ = uVar52;
  auVar158._12_4_ = uVar52;
  auVar77 = maxps(auVar77,auVar158);
  auVar195 = maxps(auVar194,auVar77);
  auVar194 = maxps(auVar173,auVar207);
  auVar77 = maxps(auVar122,auVar239);
  auVar194 = minps(auVar194,auVar77);
  auVar77 = maxps(auVar90,auVar228);
  uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar123._4_4_ = uVar52;
  auVar123._0_4_ = uVar52;
  auVar123._8_4_ = uVar52;
  auVar123._12_4_ = uVar52;
  auVar77 = minps(auVar77,auVar123);
  local_188 = auVar195._0_4_ * 0.99999964;
  fStack_184 = auVar195._4_4_ * 0.99999964;
  fStack_180 = auVar195._8_4_ * 0.99999964;
  fStack_17c = auVar195._12_4_ * 0.99999964;
  auVar77 = minps(auVar194,auVar77);
  auVar91._0_4_ = -(uint)(local_188 <= auVar77._0_4_ * 1.0000004 && PVar6 != (Primitive)0x0);
  auVar91._4_4_ = -(uint)(fStack_184 <= auVar77._4_4_ * 1.0000004 && 1 < (byte)PVar6);
  auVar91._8_4_ = -(uint)(fStack_180 <= auVar77._8_4_ * 1.0000004 && 2 < (byte)PVar6);
  auVar91._12_4_ = -(uint)(fStack_17c <= auVar77._12_4_ * 1.0000004 && 3 < (byte)PVar6);
  uVar58 = movmskps((uint)(byte)PVar6,auVar91);
  local_6a9 = uVar58 != 0;
  if (uVar58 == 0) {
    return local_6a9;
  }
  uVar58 = uVar58 & 0xff;
  local_168._0_12_ = mm_lookupmask_ps._240_12_;
  local_168._12_4_ = 0;
  local_418 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_340 = prim;
LAB_00b5e592:
  local_410 = (ulong)uVar58;
  lVar46 = 0;
  if (local_410 != 0) {
    for (; (uVar58 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
    }
  }
  local_410 = local_410 - 1 & local_410;
  local_328 = *(uint *)(local_340 + 2);
  local_568 = (ulong)local_328;
  local_338 = *(uint *)(local_340 + lVar46 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[local_568].ptr;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 + _Var8 * local_338);
  p_Var53 = pGVar7[1].intersectionFilterN;
  lVar46 = 0;
  if (local_410 != 0) {
    for (; (local_410 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
    }
  }
  pRVar54 = *(RTCFilterFunctionNArguments **)&pGVar7[1].time_range.upper;
  ppiVar1 = (int **)((long)&pRVar54->valid + (long)p_Var53 * uVar56);
  ppiVar2 = (int **)((long)&pRVar54->valid + (uVar56 + 1) * (long)p_Var53);
  ppiVar3 = (int **)((long)&pRVar54->valid + (uVar56 + 2) * (long)p_Var53);
  ppiVar4 = (int **)((long)&pRVar54->valid + (uVar56 + 3) * (long)p_Var53);
  if ((local_410 != 0) && (uVar56 = local_410 - 1 & local_410, uVar56 != 0)) {
    lVar46 = 0;
    if (uVar56 != 0) {
      for (; (uVar56 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
      }
    }
    p_Var53 = (RTCFilterFunctionN)
              ((long)p_Var53 *
              (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                              _Var8 * *(uint *)(local_340 + lVar46 * 4 + 6)));
  }
  fStack_11c = *(float *)(ray + k * 4 + 0x40);
  fStack_534 = *(float *)(ray + k * 4 + 0x50);
  local_4a8 = *(float *)(ray + k * 4 + 0x60);
  local_3e8._4_4_ = fStack_534;
  local_3e8._0_4_ = fStack_11c;
  fStack_3e0 = local_4a8;
  fStack_3dc = 0.0;
  fVar156 = fStack_534 * fStack_534;
  fVar67 = local_4a8 * local_4a8;
  fVar141 = fVar156 + fStack_11c * fStack_11c + fVar67;
  local_408._0_8_ = CONCAT44(fVar156 + fVar156 + 0.0,fVar141);
  local_408._8_4_ = fVar156 + fVar67 + fVar67;
  local_408._12_4_ = fVar156 + 0.0 + 0.0;
  auVar174._8_4_ = local_408._8_4_;
  auVar174._0_8_ = local_408._0_8_;
  auVar174._12_4_ = local_408._12_4_;
  auVar77 = rcpss(auVar174,local_408);
  local_3f8 = (2.0 - fVar141 * auVar77._0_4_) * auVar77._0_4_ *
              (((*(float *)(ppiVar1 + 1) + *(float *)(ppiVar2 + 1)) * 0.5 -
               *(float *)(ray + k * 4 + 0x20)) * local_4a8 +
              ((*(float *)((long)ppiVar1 + 4) + *(float *)((long)ppiVar2 + 4)) * 0.5 -
              *(float *)(ray + k * 4 + 0x10)) * fStack_534 +
              ((*(float *)ppiVar1 + *(float *)ppiVar2) * 0.5 - *(float *)(ray + k * 4)) * fStack_11c
              );
  fStack_3f4 = local_3f8;
  fStack_3f0 = local_3f8;
  fStack_3ec = local_3f8;
  fVar114 = fStack_11c * local_3f8 + *(float *)(ray + k * 4);
  fStack_524 = fStack_534 * local_3f8 + *(float *)(ray + k * 4 + 0x10);
  fStack_520 = local_4a8 * local_3f8 + *(float *)(ray + k * 4 + 0x20);
  fVar115 = *(float *)ppiVar1 - fVar114;
  fVar116 = *(float *)((long)ppiVar1 + 4) - fStack_524;
  fVar118 = *(float *)(ppiVar1 + 1) - fStack_520;
  fVar139 = *(float *)((long)ppiVar1 + 0xc) - 0.0;
  local_518 = *(float *)ppiVar3 - fVar114;
  fVar140 = *(float *)((long)ppiVar3 + 4) - fStack_524;
  fStack_510 = *(float *)(ppiVar3 + 1) - fStack_520;
  fStack_50c = *(float *)((long)ppiVar3 + 0xc) - 0.0;
  local_508 = *(float *)ppiVar2 - fVar114;
  fStack_504 = *(float *)((long)ppiVar2 + 4) - fStack_524;
  fStack_500 = *(float *)(ppiVar2 + 1) - fStack_520;
  fStack_4fc = *(float *)((long)ppiVar2 + 0xc) - 0.0;
  fVar114 = *(float *)ppiVar4 - fVar114;
  fStack_524 = *(float *)((long)ppiVar4 + 4) - fStack_524;
  fStack_520 = *(float *)(ppiVar4 + 1) - fStack_520;
  fStack_51c = *(float *)((long)ppiVar4 + 0xc) - 0.0;
  local_248 = fVar115;
  fStack_244 = fVar115;
  fStack_240 = fVar115;
  fStack_23c = fVar115;
  local_138 = fVar116;
  fStack_134 = fVar116;
  fStack_130 = fVar116;
  fStack_12c = fVar116;
  local_148 = fVar118;
  fStack_144 = fVar118;
  fStack_140 = fVar118;
  fStack_13c = fVar118;
  local_258 = fVar139;
  fStack_254 = fVar139;
  fStack_250 = fVar139;
  fStack_24c = fVar139;
  local_268 = local_508;
  fStack_264 = local_508;
  fStack_260 = local_508;
  fStack_25c = local_508;
  local_278 = fStack_504;
  fStack_274 = fStack_504;
  fStack_270 = fStack_504;
  fStack_26c = fStack_504;
  local_288 = fStack_500;
  fStack_284 = fStack_500;
  fStack_280 = fStack_500;
  fStack_27c = fStack_500;
  fVar156 = fStack_534 * fStack_534;
  local_298 = fStack_4fc;
  fStack_294 = fStack_4fc;
  fStack_290 = fStack_4fc;
  fStack_28c = fStack_4fc;
  fStack_11c = fStack_11c * fStack_11c;
  local_128 = fStack_11c + fVar156 + fVar67;
  fStack_124 = fStack_11c + fVar156 + fVar67;
  fStack_120 = fStack_11c + fVar156 + fVar67;
  fStack_11c = fStack_11c + fVar156 + fVar67;
  local_2a8 = fStack_510;
  fStack_2a4 = fStack_510;
  fStack_2a0 = fStack_510;
  fStack_29c = fStack_510;
  local_2b8 = fStack_50c;
  fStack_2b4 = fStack_50c;
  fStack_2b0 = fStack_50c;
  fStack_2ac = fStack_50c;
  local_2c8 = fStack_524;
  fStack_2c4 = fStack_524;
  fStack_2c0 = fStack_524;
  fStack_2bc = fStack_524;
  local_2d8 = fStack_520;
  fStack_2d4 = fStack_520;
  fStack_2d0 = fStack_520;
  fStack_2cc = fStack_520;
  local_2e8 = fStack_51c;
  fStack_2e4 = fStack_51c;
  fStack_2e0 = fStack_51c;
  fStack_2dc = fStack_51c;
  local_498 = *(float *)(ray + k * 4 + 0x40);
  fStack_494 = local_498;
  fStack_490 = local_498;
  fStack_48c = local_498;
  local_538 = fStack_534;
  fStack_530 = fStack_534;
  fStack_52c = fStack_534;
  fStack_4a4 = local_4a8;
  fStack_4a0 = local_4a8;
  fStack_49c = local_4a8;
  local_308 = ABS(local_128);
  fStack_304 = ABS(fStack_124);
  fStack_300 = ABS(fStack_120);
  fStack_2fc = ABS(fStack_11c);
  fVar156 = *(float *)(ray + k * 4 + 0x30);
  local_378 = ZEXT416((uint)local_3f8);
  local_158 = fVar156 - local_3f8;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  uStack_324 = local_328;
  uStack_320 = local_328;
  uStack_31c = local_328;
  uStack_334 = local_338;
  uStack_330 = local_338;
  uStack_32c = local_338;
  lVar46 = 1;
  local_560 = (RTCFilterFunctionNArguments *)0x1;
  bVar55 = 0;
  local_388._0_4_ = 0.0;
  local_388._4_4_ = 1.0;
  uStack_380._0_4_ = 0;
  uStack_380._4_4_ = 0;
  local_2f8 = local_518;
  fStack_2f4 = local_518;
  fStack_2f0 = local_518;
  fStack_2ec = local_518;
  uVar56 = 0;
  fVar67 = fVar114;
  fVar68 = fVar114;
  fVar113 = fVar114;
  local_548 = fVar114;
  fStack_544 = fVar114;
  fStack_540 = fVar114;
  fStack_53c = fVar114;
  local_528 = fVar114;
  fStack_514 = fVar140;
  do {
    local_458 = local_388._4_4_ - (float)local_388;
    fStack_454 = local_458;
    fStack_450 = local_458;
    fStack_44c = local_458;
    local_468 = (float)local_388;
    fStack_464 = (float)local_388;
    fStack_460 = (float)local_388;
    fStack_45c = (float)local_388;
    fVar200 = local_458 * 0.0 + (float)local_388;
    fVar202 = local_458 * 0.33333334 + (float)local_388;
    fVar189 = local_458 * 0.6666667 + (float)local_388;
    fVar212 = local_458 * 1.0 + (float)local_388;
    fVar276 = 1.0 - fVar200;
    fVar279 = 1.0 - fVar202;
    fVar288 = 1.0 - fVar189;
    fVar248 = 1.0 - fVar212;
    fVar157 = fVar200 * 3.0;
    fVar169 = fVar202 * 3.0;
    fVar170 = fVar189 * 3.0;
    fVar191 = fVar212 * 3.0;
    fVar214 = ((fVar276 * 3.0 + -5.0) * fVar276 * fVar276 + 2.0) * 0.5;
    fVar236 = ((fVar279 * 3.0 + -5.0) * fVar279 * fVar279 + 2.0) * 0.5;
    fVar282 = ((fVar288 * 3.0 + -5.0) * fVar288 * fVar288 + 2.0) * 0.5;
    fVar286 = ((fVar248 * 3.0 + -5.0) * fVar248 * fVar248 + 2.0) * 0.5;
    fVar201 = -fVar276 * fVar200 * fVar200 * 0.5;
    fVar190 = -fVar279 * fVar202 * fVar202 * 0.5;
    fVar237 = -fVar288 * fVar189 * fVar189 * 0.5;
    fVar268 = -fVar248 * fVar212 * fVar212 * 0.5;
    fVar290 = (fVar200 * fVar200 * (fVar157 + -5.0) + 2.0) * 0.5;
    fVar264 = (fVar202 * fVar202 * (fVar169 + -5.0) + 2.0) * 0.5;
    fVar266 = (fVar189 * fVar189 * (fVar170 + -5.0) + 2.0) * 0.5;
    fVar267 = (fVar212 * fVar212 * (fVar191 + -5.0) + 2.0) * 0.5;
    fVar155 = local_458 * 0.11111111;
    fVar171 = -fVar200 * fVar276 * fVar276 * 0.5;
    fVar213 = -fVar202 * fVar279 * fVar279 * 0.5;
    fVar265 = -fVar189 * fVar288 * fVar288 * 0.5;
    fVar274 = -fVar212 * fVar248 * fVar248 * 0.5;
    fVar298 = local_248 * fVar171 + local_268 * fVar290 + local_2f8 * fVar214 + fVar114 * fVar201;
    fVar301 = fStack_244 * fVar213 + fStack_264 * fVar264 + fStack_2f4 * fVar236 + fVar67 * fVar190;
    fVar302 = fStack_240 * fVar265 + fStack_260 * fVar266 + fStack_2f0 * fVar282 + fVar68 * fVar237;
    fVar303 = fStack_23c * fVar274 + fStack_25c * fVar267 + fStack_2ec * fVar286 + fVar113 * fVar268
    ;
    fVar238 = local_138 * fVar171 + local_278 * fVar290 + fVar140 * fVar214 + local_2c8 * fVar201;
    fVar247 = fStack_134 * fVar213 + fStack_274 * fVar264 + fVar140 * fVar236 + fStack_2c4 * fVar190
    ;
    fVar253 = fStack_130 * fVar265 + fStack_270 * fVar266 + fVar140 * fVar282 + fStack_2c0 * fVar237
    ;
    fVar255 = fStack_12c * fVar274 + fStack_26c * fVar267 + fVar140 * fVar286 + fStack_2bc * fVar268
    ;
    fVar246 = local_148 * fVar171 + local_288 * fVar290 + local_2a8 * fVar214 + local_2d8 * fVar201;
    fVar249 = fStack_144 * fVar213 +
              fStack_284 * fVar264 + fStack_2a4 * fVar236 + fStack_2d4 * fVar190;
    fVar254 = fStack_140 * fVar265 +
              fStack_280 * fVar266 + fStack_2a0 * fVar282 + fStack_2d0 * fVar237;
    fVar263 = fStack_13c * fVar274 +
              fStack_27c * fVar267 + fStack_29c * fVar286 + fStack_2cc * fVar268;
    fVar214 = fVar171 * local_258 + fVar290 * local_298 + fVar214 * local_2b8 + fVar201 * local_2e8;
    fVar236 = fVar213 * fStack_254 +
              fVar264 * fStack_294 + fVar236 * fStack_2b4 + fVar190 * fStack_2e4;
    uVar117 = CONCAT44(fVar236,fVar214);
    fVar265 = fVar265 * fStack_250 +
              fVar266 * fStack_290 + fVar282 * fStack_2b0 + fVar237 * fStack_2e0;
    fVar268 = fVar274 * fStack_24c +
              fVar267 * fStack_28c + fVar286 * fStack_2ac + fVar268 * fStack_2dc;
    fVar237 = fVar200 * (fVar276 + fVar276);
    fVar282 = fVar202 * (fVar279 + fVar279);
    fVar290 = fVar189 * (fVar288 + fVar288);
    fVar266 = fVar212 * (fVar248 + fVar248);
    fVar274 = (fVar237 - fVar276 * fVar276) * 0.5;
    fVar286 = (fVar282 - fVar279 * fVar279) * 0.5;
    fVar264 = (fVar290 - fVar288 * fVar288) * 0.5;
    fVar267 = (fVar266 - fVar248 * fVar248) * 0.5;
    fVar201 = (fVar200 * fVar157 + (fVar200 + fVar200) * (fVar157 + -5.0)) * 0.5;
    fVar171 = (fVar202 * fVar169 + (fVar202 + fVar202) * (fVar169 + -5.0)) * 0.5;
    fVar190 = (fVar189 * fVar170 + (fVar189 + fVar189) * (fVar170 + -5.0)) * 0.5;
    fVar213 = (fVar212 * fVar191 + (fVar212 + fVar212) * (fVar191 + -5.0)) * 0.5;
    fVar114 = ((fVar157 + 2.0) * (fVar276 + fVar276) - fVar276 * 3.0 * fVar276) * 0.5;
    fVar67 = ((fVar169 + 2.0) * (fVar279 + fVar279) - fVar279 * 3.0 * fVar279) * 0.5;
    fVar68 = ((fVar170 + 2.0) * (fVar288 + fVar288) - fVar288 * 3.0 * fVar288) * 0.5;
    fVar113 = ((fVar191 + 2.0) * (fVar248 + fVar248) - fVar248 * 3.0 * fVar248) * 0.5;
    fVar157 = (fVar200 * fVar200 - fVar237) * 0.5;
    fVar169 = (fVar202 * fVar202 - fVar282) * 0.5;
    fVar170 = (fVar189 * fVar189 - fVar290) * 0.5;
    fVar191 = (fVar212 * fVar212 - fVar266) * 0.5;
    fVar292 = (local_248 * fVar274 + local_268 * fVar201 + local_2f8 * fVar114 + local_548 * fVar157
              ) * fVar155;
    local_448 = (fStack_244 * fVar286 +
                fStack_264 * fVar171 + fStack_2f4 * fVar67 + fStack_544 * fVar169) * fVar155;
    fStack_444 = (fStack_240 * fVar264 +
                 fStack_260 * fVar190 + fStack_2f0 * fVar68 + fStack_540 * fVar170) * fVar155;
    fStack_440 = (fStack_23c * fVar267 +
                 fStack_25c * fVar213 + fStack_2ec * fVar113 + fStack_53c * fVar191) * fVar155;
    fVar248 = (local_138 * fVar274 + local_278 * fVar201 + fVar140 * fVar114 + local_2c8 * fVar157)
              * fVar155;
    fVar275 = (fStack_134 * fVar286 + fStack_274 * fVar171 + fVar140 * fVar67 + fStack_2c4 * fVar169
              ) * fVar155;
    fVar277 = (fStack_130 * fVar264 + fStack_270 * fVar190 + fVar140 * fVar68 + fStack_2c0 * fVar170
              ) * fVar155;
    fVar280 = (fStack_12c * fVar267 +
              fStack_26c * fVar213 + fVar140 * fVar113 + fStack_2bc * fVar191) * fVar155;
    local_428 = (local_148 * fVar274 +
                local_288 * fVar201 + local_2a8 * fVar114 + local_2d8 * fVar157) * fVar155;
    fStack_424 = (fStack_144 * fVar286 +
                 fStack_284 * fVar171 + fStack_2a4 * fVar67 + fStack_2d4 * fVar169) * fVar155;
    fStack_420 = (fStack_140 * fVar264 +
                 fStack_280 * fVar190 + fStack_2a0 * fVar68 + fStack_2d0 * fVar170) * fVar155;
    fStack_41c = (fStack_13c * fVar267 +
                 fStack_27c * fVar213 + fStack_29c * fVar113 + fStack_2cc * fVar191) * fVar155;
    fVar67 = fVar155 * (fVar286 * fStack_254 +
                       fVar171 * fStack_294 + fVar67 * fStack_2b4 + fVar169 * fStack_2e4);
    fVar68 = fVar155 * (fVar264 * fStack_250 +
                       fVar190 * fStack_290 + fVar68 * fStack_2b0 + fVar170 * fStack_2e0);
    fVar113 = fVar155 * (fVar267 * fStack_24c +
                        fVar213 * fStack_28c + fVar113 * fStack_2ac + fVar191 * fStack_2dc);
    auVar159._4_4_ = fVar265;
    auVar159._0_4_ = fVar236;
    auVar159._8_4_ = fVar268;
    auVar159._12_4_ = 0;
    auVar208._0_4_ =
         fVar214 + fVar155 * (fVar274 * local_258 +
                             fVar201 * local_298 + fVar114 * local_2b8 + fVar157 * local_2e8);
    auVar208._4_4_ = fVar236 + fVar67;
    auVar208._8_4_ = fVar265 + fVar68;
    auVar208._12_4_ = fVar268 + fVar113;
    auVar240._0_8_ = CONCAT44(fVar265 - fVar68,fVar236 - fVar67);
    auVar240._8_4_ = fVar268 - fVar113;
    auVar240._12_4_ = 0;
    local_4b8._0_4_ = fVar247 - fVar238;
    local_4b8._4_4_ = fVar253 - fVar247;
    fStack_4b0 = fVar255 - fVar253;
    fStack_4ac = 0.0 - fVar255;
    fVar213 = fVar249 - fVar246;
    fVar214 = fVar254 - fVar249;
    fVar236 = fVar263 - fVar254;
    fVar237 = 0.0 - fVar263;
    fVar67 = fVar248 * fVar213 - local_428 * (float)local_4b8._0_4_;
    fVar68 = fVar275 * fVar214 - fStack_424 * (float)local_4b8._4_4_;
    fVar113 = fVar277 * fVar236 - fStack_420 * fStack_4b0;
    fVar114 = fVar280 * fVar237 - fStack_41c * fStack_4ac;
    fVar155 = fVar301 - fVar298;
    fVar169 = fVar302 - fVar301;
    fVar191 = fVar303 - fVar302;
    fVar201 = 0.0 - fVar303;
    fVar171 = local_428 * fVar155 - fVar292 * fVar213;
    fVar189 = fStack_424 * fVar169 - local_448 * fVar214;
    fVar190 = fStack_420 * fVar191 - fStack_444 * fVar236;
    fVar212 = fStack_41c * fVar201 - fStack_440 * fVar237;
    fVar274 = fVar292 * (float)local_4b8._0_4_ - fVar248 * fVar155;
    fVar276 = local_448 * (float)local_4b8._4_4_ - fVar275 * fVar169;
    fVar279 = fStack_444 * fStack_4b0 - fVar277 * fVar191;
    fVar282 = fStack_440 * fStack_4ac - fVar280 * fVar201;
    auVar229._0_4_ = (float)local_4b8._0_4_ * (float)local_4b8._0_4_ + fVar213 * fVar213;
    auVar229._4_4_ = (float)local_4b8._4_4_ * (float)local_4b8._4_4_ + fVar214 * fVar214;
    auVar229._8_4_ = fStack_4b0 * fStack_4b0 + fVar236 * fVar236;
    auVar229._12_4_ = fStack_4ac * fStack_4ac + fVar237 * fVar237;
    auVar250._0_4_ = fVar155 * fVar155 + auVar229._0_4_;
    auVar250._4_4_ = fVar169 * fVar169 + auVar229._4_4_;
    auVar250._8_4_ = fVar191 * fVar191 + auVar229._8_4_;
    auVar250._12_4_ = fVar201 * fVar201 + auVar229._12_4_;
    auVar77 = rcpps(auVar229,auVar250);
    fVar157 = auVar77._0_4_;
    fVar170 = auVar77._4_4_;
    fVar200 = auVar77._8_4_;
    fVar202 = auVar77._12_4_;
    fVar157 = (1.0 - fVar157 * auVar250._0_4_) * fVar157 + fVar157;
    fVar170 = (1.0 - fVar170 * auVar250._4_4_) * fVar170 + fVar170;
    fVar200 = (1.0 - fVar200 * auVar250._8_4_) * fVar200 + fVar200;
    fVar202 = (1.0 - fVar202 * auVar250._12_4_) * fVar202 + fVar202;
    fVar286 = fVar213 * fVar275 - (float)local_4b8._0_4_ * fStack_424;
    fVar288 = fVar214 * fVar277 - (float)local_4b8._4_4_ * fStack_420;
    fVar290 = fVar236 * fVar280 - fStack_4b0 * fStack_41c;
    fVar264 = fVar237 * 0.0 - fStack_4ac * 0.0;
    fVar266 = fVar155 * fStack_424 - fVar213 * local_448;
    fVar267 = fVar169 * fStack_420 - fVar214 * fStack_444;
    fVar278 = fVar191 * fStack_41c - fVar236 * fStack_440;
    fVar281 = fVar201 * 0.0 - fVar237 * 0.0;
    auVar299._8_4_ = fVar265;
    auVar299._0_8_ = uVar117;
    auVar299._12_4_ = fVar268;
    uStack_43c = 0;
    fVar283 = (float)local_4b8._0_4_ * local_448 - fVar155 * fVar275;
    fVar287 = (float)local_4b8._4_4_ * fStack_444 - fVar169 * fVar277;
    fVar289 = fStack_4b0 * fStack_440 - fVar191 * fVar280;
    fVar291 = fStack_4ac * 0.0 - fVar201 * 0.0;
    auVar124._0_4_ = (fVar67 * fVar67 + fVar171 * fVar171 + fVar274 * fVar274) * fVar157;
    auVar124._4_4_ = (fVar68 * fVar68 + fVar189 * fVar189 + fVar276 * fVar276) * fVar170;
    auVar124._8_4_ = (fVar113 * fVar113 + fVar190 * fVar190 + fVar279 * fVar279) * fVar200;
    auVar124._12_4_ = (fVar114 * fVar114 + fVar212 * fVar212 + fVar282 * fVar282) * fVar202;
    auVar256._0_4_ = (fVar286 * fVar286 + fVar266 * fVar266 + fVar283 * fVar283) * fVar157;
    auVar256._4_4_ = (fVar288 * fVar288 + fVar267 * fVar267 + fVar287 * fVar287) * fVar170;
    auVar256._8_4_ = (fVar290 * fVar290 + fVar278 * fVar278 + fVar289 * fVar289) * fVar200;
    auVar256._12_4_ = (fVar264 * fVar264 + fVar281 * fVar281 + fVar291 * fVar291) * fVar202;
    auVar77 = maxps(auVar124,auVar256);
    auVar230._8_4_ = fVar265;
    auVar230._0_8_ = uVar117;
    auVar230._12_4_ = fVar268;
    auVar195 = maxps(auVar230,auVar208);
    auVar175._8_4_ = auVar240._8_4_;
    auVar175._0_8_ = auVar240._0_8_;
    auVar175._12_4_ = 0;
    auVar194 = maxps(auVar175,auVar159);
    auVar195 = maxps(auVar195,auVar194);
    auVar300 = minps(auVar299,auVar208);
    auVar194 = minps(auVar240,auVar159);
    auVar300 = minps(auVar300,auVar194);
    auVar77 = sqrtps(auVar77,auVar77);
    auVar194 = rsqrtps(auVar77,auVar250);
    fVar67 = auVar194._0_4_;
    fVar68 = auVar194._4_4_;
    fVar113 = auVar194._8_4_;
    fVar114 = auVar194._12_4_;
    local_398._0_4_ = fVar67 * 1.5 - fVar67 * fVar67 * auVar250._0_4_ * 0.5 * fVar67;
    local_398._4_4_ = fVar68 * 1.5 - fVar68 * fVar68 * auVar250._4_4_ * 0.5 * fVar68;
    fStack_390 = fVar113 * 1.5 - fVar113 * fVar113 * auVar250._8_4_ * 0.5 * fVar113;
    fStack_38c = fVar114 * 1.5 - fVar114 * fVar114 * auVar250._12_4_ * 0.5 * fVar114;
    local_438 = 0.0 - fVar238;
    fStack_434 = 0.0 - fVar247;
    fStack_430 = 0.0 - fVar253;
    fStack_42c = 0.0 - fVar255;
    fVar279 = 0.0 - fVar246;
    fVar282 = 0.0 - fVar249;
    fVar286 = 0.0 - fVar254;
    fVar288 = 0.0 - fVar263;
    fVar265 = 0.0 - fVar298;
    fVar268 = 0.0 - fVar301;
    fVar274 = 0.0 - fVar302;
    fVar276 = 0.0 - fVar303;
    auVar241._0_4_ = local_4a8 * fVar213 * (float)local_398._0_4_;
    auVar241._4_4_ = fStack_4a4 * fVar214 * (float)local_398._4_4_;
    auVar241._8_4_ = fStack_4a0 * fVar236 * fStack_390;
    auVar241._12_4_ = fStack_49c * fVar237 * fStack_38c;
    local_178._0_4_ =
         local_498 * fVar155 * (float)local_398._0_4_ +
         local_538 * (float)local_4b8._0_4_ * (float)local_398._0_4_ + auVar241._0_4_;
    local_178._4_4_ =
         fStack_494 * fVar169 * (float)local_398._4_4_ +
         fStack_534 * (float)local_4b8._4_4_ * (float)local_398._4_4_ + auVar241._4_4_;
    local_178._8_4_ =
         fStack_490 * fVar191 * fStack_390 + fStack_530 * fStack_4b0 * fStack_390 + auVar241._8_4_;
    local_178._12_4_ =
         fStack_48c * fVar201 * fStack_38c + fStack_52c * fStack_4ac * fStack_38c + auVar241._12_4_;
    local_3b8 = fVar155 * (float)local_398._0_4_ * fVar265 +
                (float)local_4b8._0_4_ * (float)local_398._0_4_ * local_438 +
                fVar213 * (float)local_398._0_4_ * fVar279;
    fStack_3b4 = fVar169 * (float)local_398._4_4_ * fVar268 +
                 (float)local_4b8._4_4_ * (float)local_398._4_4_ * fStack_434 +
                 fVar214 * (float)local_398._4_4_ * fVar282;
    fStack_3b0 = fVar191 * fStack_390 * fVar274 +
                 fStack_4b0 * fStack_390 * fStack_430 + fVar236 * fStack_390 * fVar286;
    fStack_3ac = fVar201 * fStack_38c * fVar276 +
                 fStack_4ac * fStack_38c * fStack_42c + fVar237 * fStack_38c * fVar288;
    fVar171 = (local_498 * fVar265 + local_538 * local_438 + local_4a8 * fVar279) -
              local_178._0_4_ * local_3b8;
    fVar189 = (fStack_494 * fVar268 + fStack_534 * fStack_434 + fStack_4a4 * fVar282) -
              local_178._4_4_ * fStack_3b4;
    fVar190 = (fStack_490 * fVar274 + fStack_530 * fStack_430 + fStack_4a0 * fVar286) -
              local_178._8_4_ * fStack_3b0;
    fVar212 = (fStack_48c * fVar276 + fStack_52c * fStack_42c + fStack_49c * fVar288) -
              local_178._12_4_ * fStack_3ac;
    fVar157 = (fVar265 * fVar265 + local_438 * local_438 + fVar279 * fVar279) -
              local_3b8 * local_3b8;
    fVar170 = (fVar268 * fVar268 + fStack_434 * fStack_434 + fVar282 * fVar282) -
              fStack_3b4 * fStack_3b4;
    fVar200 = (fVar274 * fVar274 + fStack_430 * fStack_430 + fVar286 * fVar286) -
              fStack_3b0 * fStack_3b0;
    fVar202 = (fVar276 * fVar276 + fStack_42c * fStack_42c + fVar288 * fVar288) -
              fStack_3ac * fStack_3ac;
    fVar67 = (auVar195._0_4_ + auVar77._0_4_) * 1.0000002;
    fVar68 = (auVar195._4_4_ + auVar77._4_4_) * 1.0000002;
    fVar113 = (auVar195._8_4_ + auVar77._8_4_) * 1.0000002;
    fVar114 = (auVar195._12_4_ + auVar77._12_4_) * 1.0000002;
    fVar67 = fVar157 - fVar67 * fVar67;
    fVar68 = fVar170 - fVar68 * fVar68;
    fVar113 = fVar200 - fVar113 * fVar113;
    fVar114 = fVar202 - fVar114 * fVar114;
    local_3a8._0_4_ = local_178._0_4_ * local_178._0_4_;
    local_3a8._4_4_ = local_178._4_4_ * local_178._4_4_;
    fStack_3a0 = local_178._8_4_ * local_178._8_4_;
    fStack_39c = local_178._12_4_ * local_178._12_4_;
    local_318._0_4_ = local_128 - (float)local_3a8._0_4_;
    local_318._4_4_ = fStack_124 - (float)local_3a8._4_4_;
    local_318._8_4_ = fStack_120 - fStack_3a0;
    local_318._12_4_ = fStack_11c - fStack_39c;
    fVar171 = fVar171 + fVar171;
    fVar189 = fVar189 + fVar189;
    fVar190 = fVar190 + fVar190;
    fVar212 = fVar212 + fVar212;
    local_4c8._0_4_ = local_318._0_4_ * 4.0;
    local_4c8._4_4_ = local_318._4_4_ * 4.0;
    fStack_4c0 = local_318._8_4_ * 4.0;
    fStack_4bc = local_318._12_4_ * 4.0;
    auVar231._0_4_ = fVar171 * fVar171 - (float)local_4c8._0_4_ * fVar67;
    auVar231._4_4_ = fVar189 * fVar189 - (float)local_4c8._4_4_ * fVar68;
    auVar231._8_4_ = fVar190 * fVar190 - fStack_4c0 * fVar113;
    auVar231._12_4_ = fVar212 * fVar212 - fStack_4bc * fVar114;
    local_488 = (auVar300._0_4_ - auVar77._0_4_) * 0.99999976;
    fStack_484 = (auVar300._4_4_ - auVar77._4_4_) * 0.99999976;
    fStack_480 = (auVar300._8_4_ - auVar77._8_4_) * 0.99999976;
    fStack_47c = (auVar300._12_4_ - auVar77._12_4_) * 0.99999976;
    auVar160._4_4_ = -(uint)(0.0 <= auVar231._4_4_);
    auVar160._0_4_ = -(uint)(0.0 <= auVar231._0_4_);
    auVar160._8_4_ = -(uint)(0.0 <= auVar231._8_4_);
    auVar160._12_4_ = -(uint)(0.0 <= auVar231._12_4_);
    uVar52 = (undefined4)((ulong)lVar46 >> 0x20);
    iVar43 = movmskps((int)lVar46,auVar160);
    if (iVar43 == 0) {
      iVar43 = 0;
      auVar177 = _DAT_01feb9f0;
      auVar257 = _DAT_01feba00;
    }
    else {
      auVar194 = sqrtps(_local_4b8,auVar231);
      uVar58 = -(uint)(0.0 <= auVar231._0_4_);
      uVar60 = -(uint)(0.0 <= auVar231._4_4_);
      uVar62 = -(uint)(0.0 <= auVar231._8_4_);
      uVar64 = -(uint)(0.0 <= auVar231._12_4_);
      auVar176._0_4_ = local_318._0_4_ + local_318._0_4_;
      auVar176._4_4_ = local_318._4_4_ + local_318._4_4_;
      auVar176._8_4_ = local_318._8_4_ + local_318._8_4_;
      auVar176._12_4_ = local_318._12_4_ + local_318._12_4_;
      auVar77 = rcpps(auVar241,auVar176);
      fVar290 = auVar77._0_4_;
      fVar266 = auVar77._4_4_;
      fVar278 = auVar77._8_4_;
      fVar283 = auVar77._12_4_;
      fVar290 = (1.0 - auVar176._0_4_ * fVar290) * fVar290 + fVar290;
      fVar266 = (1.0 - auVar176._4_4_ * fVar266) * fVar266 + fVar266;
      fVar278 = (1.0 - auVar176._8_4_ * fVar278) * fVar278 + fVar278;
      fVar283 = (1.0 - auVar176._12_4_ * fVar283) * fVar283 + fVar283;
      fVar264 = (-fVar171 - auVar194._0_4_) * fVar290;
      fVar267 = (-fVar189 - auVar194._4_4_) * fVar266;
      fVar281 = (-fVar190 - auVar194._8_4_) * fVar278;
      fVar287 = (-fVar212 - auVar194._12_4_) * fVar283;
      fVar290 = (auVar194._0_4_ - fVar171) * fVar290;
      fVar266 = (auVar194._4_4_ - fVar189) * fVar266;
      fVar278 = (auVar194._8_4_ - fVar190) * fVar278;
      fVar283 = (auVar194._12_4_ - fVar212) * fVar283;
      local_358[0] = (local_178._0_4_ * fVar264 + local_3b8) * (float)local_398._0_4_;
      local_358[1] = (local_178._4_4_ * fVar267 + fStack_3b4) * (float)local_398._4_4_;
      local_358[2] = (local_178._8_4_ * fVar281 + fStack_3b0) * fStack_390;
      local_358[3] = (local_178._12_4_ * fVar287 + fStack_3ac) * fStack_38c;
      local_368[0] = (local_178._0_4_ * fVar290 + local_3b8) * (float)local_398._0_4_;
      local_368[1] = (local_178._4_4_ * fVar266 + fStack_3b4) * (float)local_398._4_4_;
      local_368[2] = (local_178._8_4_ * fVar278 + fStack_3b0) * fStack_390;
      local_368[3] = (local_178._12_4_ * fVar283 + fStack_3ac) * fStack_38c;
      auVar242._0_4_ = (uint)fVar264 & uVar58;
      auVar242._4_4_ = (uint)fVar267 & uVar60;
      auVar242._8_4_ = (uint)fVar281 & uVar62;
      auVar242._12_4_ = (uint)fVar287 & uVar64;
      auVar177._0_8_ = CONCAT44(~uVar60,~uVar58) & 0x7f8000007f800000;
      auVar177._8_4_ = ~uVar62 & 0x7f800000;
      auVar177._12_4_ = ~uVar64 & 0x7f800000;
      auVar177 = auVar177 | auVar242;
      auVar295._0_4_ = (uint)fVar290 & uVar58;
      auVar295._4_4_ = (uint)fVar266 & uVar60;
      auVar295._8_4_ = (uint)fVar278 & uVar62;
      auVar295._12_4_ = (uint)fVar283 & uVar64;
      auVar257._0_8_ = CONCAT44(~uVar60,~uVar58) & 0xff800000ff800000;
      auVar257._8_4_ = ~uVar62 & 0xff800000;
      auVar257._12_4_ = ~uVar64 & 0xff800000;
      auVar257 = auVar257 | auVar295;
      auVar144._0_8_ = CONCAT44(local_3a8._4_4_,local_3a8._0_4_) & 0x7fffffff7fffffff;
      auVar144._8_4_ = ABS(fStack_3a0);
      auVar144._12_4_ = ABS(fStack_39c);
      auVar24._4_4_ = fStack_304;
      auVar24._0_4_ = local_308;
      auVar24._8_4_ = fStack_300;
      auVar24._12_4_ = fStack_2fc;
      auVar77 = maxps(auVar24,auVar144);
      fVar290 = auVar77._0_4_ * 1.9073486e-06;
      fVar264 = auVar77._4_4_ * 1.9073486e-06;
      fVar266 = auVar77._8_4_ * 1.9073486e-06;
      fVar267 = auVar77._12_4_ * 1.9073486e-06;
      auVar296._0_4_ = -(uint)(ABS(local_318._0_4_) < fVar290 && 0.0 <= auVar231._0_4_);
      auVar296._4_4_ = -(uint)(ABS(local_318._4_4_) < fVar264 && 0.0 <= auVar231._4_4_);
      auVar296._8_4_ = -(uint)(ABS(local_318._8_4_) < fVar266 && 0.0 <= auVar231._8_4_);
      auVar296._12_4_ = -(uint)(ABS(local_318._12_4_) < fVar267 && 0.0 <= auVar231._12_4_);
      iVar43 = movmskps(iVar43,auVar296);
      if (iVar43 != 0) {
        auVar243._4_4_ = -(uint)(fVar264 <= ABS(local_318._4_4_));
        auVar243._0_4_ = -(uint)(fVar290 <= ABS(local_318._0_4_));
        auVar243._8_4_ = -(uint)(fVar266 <= ABS(local_318._8_4_));
        auVar243._12_4_ = -(uint)(fVar267 <= ABS(local_318._12_4_));
        uVar59 = -(uint)(fVar67 <= 0.0);
        uVar61 = -(uint)(fVar68 <= 0.0);
        uVar63 = -(uint)(fVar113 <= 0.0);
        uVar65 = -(uint)(fVar114 <= 0.0);
        auVar273._4_4_ = uVar61;
        auVar273._0_4_ = uVar59;
        auVar273._8_4_ = uVar63;
        auVar273._12_4_ = uVar65;
        auVar285._0_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar296._0_4_;
        auVar285._4_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar296._4_4_;
        auVar285._8_4_ = (uVar63 & 0xff800000 | ~uVar63 & 0x7f800000) & auVar296._8_4_;
        auVar285._12_4_ = (uVar65 & 0xff800000 | ~uVar65 & 0x7f800000) & auVar296._12_4_;
        auVar92._0_4_ = ~auVar296._0_4_ & auVar177._0_4_;
        auVar92._4_4_ = ~auVar296._4_4_ & auVar177._4_4_;
        auVar92._8_4_ = ~auVar296._8_4_ & auVar177._8_4_;
        auVar92._12_4_ = ~auVar296._12_4_ & auVar177._12_4_;
        auVar178._0_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar296._0_4_;
        auVar178._4_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar296._4_4_;
        auVar178._8_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar296._8_4_;
        auVar178._12_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar296._12_4_;
        auVar297._0_4_ = ~auVar296._0_4_ & auVar257._0_4_;
        auVar297._4_4_ = ~auVar296._4_4_ & auVar257._4_4_;
        auVar297._8_4_ = ~auVar296._8_4_ & auVar257._8_4_;
        auVar297._12_4_ = ~auVar296._12_4_ & auVar257._12_4_;
        auVar273 = auVar273 | auVar243;
        auVar160._4_4_ = auVar273._4_4_ & uVar60;
        auVar160._0_4_ = auVar273._0_4_ & uVar58;
        auVar160._8_4_ = auVar273._8_4_ & uVar62;
        auVar160._12_4_ = auVar273._12_4_ & uVar64;
        auVar177 = auVar92 | auVar285;
        auVar257 = auVar297 | auVar178;
      }
    }
    auVar161._0_4_ = (auVar160._0_4_ << 0x1f) >> 0x1f;
    auVar161._4_4_ = (auVar160._4_4_ << 0x1f) >> 0x1f;
    auVar161._8_4_ = (auVar160._8_4_ << 0x1f) >> 0x1f;
    auVar161._12_4_ = (auVar160._12_4_ << 0x1f) >> 0x1f;
    auVar161 = auVar161 & local_168;
    iVar43 = movmskps(iVar43,auVar161);
    lVar46 = CONCAT44(uVar52,iVar43);
    fVar114 = local_548;
    fVar67 = fStack_544;
    fVar68 = fStack_540;
    fVar113 = fStack_53c;
    if (iVar43 != 0) {
      auVar251._0_4_ = *(float *)(ray + k * 4 + 0x80) - (float)local_378._0_4_;
      auVar251._4_4_ = auVar251._0_4_;
      auVar251._8_4_ = auVar251._0_4_;
      auVar251._12_4_ = auVar251._0_4_;
      auVar195 = minps(auVar251,auVar257);
      auVar26._4_4_ = fStack_154;
      auVar26._0_4_ = local_158;
      auVar26._8_4_ = fStack_150;
      auVar26._12_4_ = fStack_14c;
      auVar194 = maxps(auVar26,auVar177);
      auVar93._0_4_ = fVar248 * local_538 + local_428 * local_4a8;
      auVar93._4_4_ = fVar275 * fStack_534 + fStack_424 * fStack_4a4;
      auVar93._8_4_ = fVar277 * fStack_530 + fStack_420 * fStack_4a0;
      auVar93._12_4_ = fVar280 * fStack_52c + fStack_41c * fStack_49c;
      auVar196._0_4_ = fVar292 * local_498 + auVar93._0_4_;
      auVar196._4_4_ = local_448 * fStack_494 + auVar93._4_4_;
      auVar196._8_4_ = fStack_444 * fStack_490 + auVar93._8_4_;
      auVar196._12_4_ = fStack_440 * fStack_48c + auVar93._12_4_;
      auVar77 = rcpps(auVar93,auVar196);
      fVar290 = auVar77._0_4_;
      fVar264 = auVar77._4_4_;
      fVar266 = auVar77._8_4_;
      fVar267 = auVar77._12_4_;
      fVar278 = (float)DAT_01ff1d40;
      fVar281 = DAT_01ff1d40._4_4_;
      fVar283 = DAT_01ff1d40._8_4_;
      fVar287 = DAT_01ff1d40._12_4_;
      fVar265 = ((1.0 - auVar196._0_4_ * fVar290) * fVar290 + fVar290) *
                -(fVar265 * fVar292 + local_438 * fVar248 + fVar279 * local_428);
      fVar268 = ((1.0 - auVar196._4_4_ * fVar264) * fVar264 + fVar264) *
                -(fVar268 * local_448 + fStack_434 * fVar275 + fVar282 * fStack_424);
      fVar274 = ((1.0 - auVar196._8_4_ * fVar266) * fVar266 + fVar266) *
                -(fVar274 * fStack_444 + fStack_430 * fVar277 + fVar286 * fStack_420);
      fVar276 = ((1.0 - auVar196._12_4_ * fVar267) * fVar267 + fVar267) *
                -(fVar276 * fStack_440 + fStack_42c * fVar280 + fVar288 * fStack_41c);
      auVar244._0_12_ = ZEXT812(0);
      auVar244._12_4_ = 0;
      uVar58 = -(uint)(auVar196._0_4_ < 0.0 || ABS(auVar196._0_4_) < fVar278);
      uVar60 = -(uint)(auVar196._4_4_ < 0.0 || ABS(auVar196._4_4_) < fVar281);
      uVar62 = -(uint)(auVar196._8_4_ < 0.0 || ABS(auVar196._8_4_) < fVar283);
      uVar64 = -(uint)(auVar196._12_4_ < 0.0 || ABS(auVar196._12_4_) < fVar287);
      auVar179._0_8_ = CONCAT44(uVar60,uVar58) & 0xff800000ff800000;
      auVar179._8_4_ = uVar62 & 0xff800000;
      auVar179._12_4_ = uVar64 & 0xff800000;
      auVar94._0_4_ = ~uVar58 & (uint)fVar265;
      auVar94._4_4_ = ~uVar60 & (uint)fVar268;
      auVar94._8_4_ = ~uVar62 & (uint)fVar274;
      auVar94._12_4_ = ~uVar64 & (uint)fVar276;
      auVar194 = maxps(auVar194,auVar94 | auVar179);
      uVar58 = -(uint)(0.0 < auVar196._0_4_ || ABS(auVar196._0_4_) < fVar278);
      uVar60 = -(uint)(0.0 < auVar196._4_4_ || ABS(auVar196._4_4_) < fVar281);
      uVar62 = -(uint)(0.0 < auVar196._8_4_ || ABS(auVar196._8_4_) < fVar283);
      uVar64 = -(uint)(0.0 < auVar196._12_4_ || ABS(auVar196._12_4_) < fVar287);
      auVar95._0_8_ = CONCAT44(uVar60,uVar58) & 0x7f8000007f800000;
      auVar95._8_4_ = uVar62 & 0x7f800000;
      auVar95._12_4_ = uVar64 & 0x7f800000;
      auVar197._0_4_ = ~uVar58 & (uint)fVar265;
      auVar197._4_4_ = ~uVar60 & (uint)fVar268;
      auVar197._8_4_ = ~uVar62 & (uint)fVar274;
      auVar197._12_4_ = ~uVar64 & (uint)fVar276;
      auVar195 = minps(auVar195,auVar197 | auVar95);
      auVar125._0_4_ = (0.0 - fVar247) * -fVar275 + (0.0 - fVar249) * -fStack_424;
      auVar125._4_4_ = (0.0 - fVar253) * -fVar277 + (0.0 - fVar254) * -fStack_420;
      auVar125._8_4_ = (0.0 - fVar255) * -fVar280 + (0.0 - fVar263) * -fStack_41c;
      auVar125._12_4_ = 0x80000000;
      auVar293._0_4_ = -local_448 * local_498 + -fVar275 * local_538 + -fStack_424 * local_4a8;
      auVar293._4_4_ = -fStack_444 * fStack_494 + -fVar277 * fStack_534 + -fStack_420 * fStack_4a4;
      auVar293._8_4_ = -fStack_440 * fStack_490 + -fVar280 * fStack_530 + -fStack_41c * fStack_4a0;
      auVar293._12_4_ = fStack_48c * -0.0 + fStack_52c * -0.0 + fStack_49c * -0.0;
      auVar77 = rcpps(auVar125,auVar293);
      fVar265 = auVar77._0_4_;
      fVar268 = auVar77._4_4_;
      fVar274 = auVar77._8_4_;
      fVar276 = auVar77._12_4_;
      fVar265 = (((float)DAT_01feca10 - auVar293._0_4_ * fVar265) * fVar265 + fVar265) *
                -((0.0 - fVar301) * -local_448 + auVar125._0_4_);
      fVar268 = ((DAT_01feca10._4_4_ - auVar293._4_4_ * fVar268) * fVar268 + fVar268) *
                -((0.0 - fVar302) * -fStack_444 + auVar125._4_4_);
      fVar274 = ((DAT_01feca10._8_4_ - auVar293._8_4_ * fVar274) * fVar274 + fVar274) *
                -((0.0 - fVar303) * -fStack_440 + auVar125._8_4_);
      fVar276 = ((DAT_01feca10._12_4_ - auVar293._12_4_ * fVar276) * fVar276 + fVar276) * 0.0;
      uVar58 = -(uint)(auVar293._0_4_ < 0.0 || ABS(auVar293._0_4_) < fVar278);
      uVar60 = -(uint)(auVar293._4_4_ < 0.0 || ABS(auVar293._4_4_) < fVar281);
      uVar62 = -(uint)(auVar293._8_4_ < 0.0 || ABS(auVar293._8_4_) < fVar283);
      uVar64 = -(uint)(auVar293._12_4_ < 0.0 || ABS(auVar293._12_4_) < fVar287);
      auVar126._0_8_ = CONCAT44(uVar60,uVar58) & 0xff800000ff800000;
      auVar126._8_4_ = uVar62 & 0xff800000;
      auVar126._12_4_ = uVar64 & 0xff800000;
      auVar96._0_4_ = ~uVar58 & (uint)fVar265;
      auVar96._4_4_ = ~uVar60 & (uint)fVar268;
      auVar96._8_4_ = ~uVar62 & (uint)fVar274;
      auVar96._12_4_ = ~uVar64 & (uint)fVar276;
      local_478 = maxps(auVar194,auVar96 | auVar126);
      uVar58 = -(uint)(0.0 < auVar293._0_4_ || ABS(auVar293._0_4_) < fVar278);
      uVar60 = -(uint)(0.0 < auVar293._4_4_ || ABS(auVar293._4_4_) < fVar281);
      uVar62 = -(uint)(0.0 < auVar293._8_4_ || ABS(auVar293._8_4_) < fVar283);
      uVar64 = -(uint)(0.0 < auVar293._12_4_ || ABS(auVar293._12_4_) < fVar287);
      auVar97._0_8_ = CONCAT44(uVar60,uVar58) & 0x7f8000007f800000;
      auVar97._8_4_ = uVar62 & 0x7f800000;
      auVar97._12_4_ = uVar64 & 0x7f800000;
      auVar294._0_4_ = ~uVar58 & (uint)fVar265;
      auVar294._4_4_ = ~uVar60 & (uint)fVar268;
      auVar294._8_4_ = ~uVar62 & (uint)fVar274;
      auVar294._12_4_ = ~uVar64 & (uint)fVar276;
      local_198 = minps(auVar195,auVar294 | auVar97);
      fVar265 = local_478._12_4_;
      fVar268 = local_478._0_4_;
      fVar274 = local_478._4_4_;
      fVar276 = local_478._8_4_;
      auVar258._0_4_ = -(uint)(fVar268 <= local_198._0_4_) & auVar161._0_4_;
      auVar258._4_4_ = -(uint)(fVar274 <= local_198._4_4_) & auVar161._4_4_;
      auVar258._8_4_ = -(uint)(fVar276 <= local_198._8_4_) & auVar161._8_4_;
      auVar258._12_4_ = -(uint)(fVar265 <= local_198._12_4_) & auVar161._12_4_;
      iVar43 = movmskps(iVar43,auVar258);
      lVar46 = CONCAT44(uVar52,iVar43);
      if (iVar43 != 0) {
        auVar21._4_4_ = fStack_484;
        auVar21._0_4_ = local_488;
        auVar21._8_4_ = fStack_480;
        auVar21._12_4_ = fStack_47c;
        auVar77 = maxps(ZEXT816(0),auVar21);
        auVar23._4_4_ = local_358[1];
        auVar23._0_4_ = local_358[0];
        auVar23._8_4_ = local_358[2];
        auVar23._12_4_ = local_358[3];
        auVar194 = minps(auVar23,_DAT_01feca10);
        auVar209._0_12_ = ZEXT812(0);
        auVar209._12_4_ = 0;
        auVar194 = maxps(auVar194,auVar209);
        auVar22._4_4_ = local_368[1];
        auVar22._0_4_ = local_368[0];
        auVar22._8_4_ = local_368[2];
        auVar22._12_4_ = local_368[3];
        auVar195 = minps(auVar22,_DAT_01feca10);
        auVar195 = maxps(auVar195,auVar209);
        local_358[0] = (auVar194._0_4_ + 0.0) * 0.25 * local_458 + (float)local_388;
        local_358[1] = (auVar194._4_4_ + 1.0) * 0.25 * local_458 + (float)local_388;
        local_358[2] = (auVar194._8_4_ + 2.0) * 0.25 * local_458 + (float)local_388;
        local_358[3] = (auVar194._12_4_ + 3.0) * 0.25 * local_458 + (float)local_388;
        local_368[0] = (auVar195._0_4_ + 0.0) * 0.25 * local_458 + (float)local_388;
        local_368[1] = (auVar195._4_4_ + 1.0) * 0.25 * local_458 + (float)local_388;
        local_368[2] = (auVar195._8_4_ + 2.0) * 0.25 * local_458 + (float)local_388;
        local_368[3] = (auVar195._12_4_ + 3.0) * 0.25 * local_458 + (float)local_388;
        fVar157 = fVar157 - auVar77._0_4_ * auVar77._0_4_;
        fVar170 = fVar170 - auVar77._4_4_ * auVar77._4_4_;
        fVar200 = fVar200 - auVar77._8_4_ * auVar77._8_4_;
        fVar202 = fVar202 - auVar77._12_4_ * auVar77._12_4_;
        auVar145._0_4_ = fVar171 * fVar171 - (float)local_4c8._0_4_ * fVar157;
        auVar145._4_4_ = fVar189 * fVar189 - (float)local_4c8._4_4_ * fVar170;
        auVar145._8_4_ = fVar190 * fVar190 - fStack_4c0 * fVar200;
        auVar145._12_4_ = fVar212 * fVar212 - fStack_4bc * fVar202;
        local_4c8._4_4_ = -(uint)(0.0 <= auVar145._4_4_);
        local_4c8._0_4_ = -(uint)(0.0 <= auVar145._0_4_);
        fStack_4c0 = (float)-(uint)(0.0 <= auVar145._8_4_);
        fStack_4bc = (float)-(uint)(0.0 <= auVar145._12_4_);
        iVar43 = movmskps(iVar43,_local_4c8);
        if (iVar43 == 0) {
          _local_598 = ZEXT816(0);
          fVar171 = 0.0;
          fVar189 = 0.0;
          fVar190 = 0.0;
          fVar212 = 0.0;
          fVar155 = 0.0;
          fVar169 = 0.0;
          fVar191 = 0.0;
          fVar201 = 0.0;
          _local_5c8 = ZEXT816(0);
          _local_5d8 = ZEXT816(0);
          _local_558 = ZEXT816(0);
          iVar43 = 0;
          auVar98 = _DAT_01feb9f0;
          auVar211 = _DAT_01feba00;
        }
        else {
          auVar194 = sqrtps(auVar244,auVar145);
          auVar127._0_4_ = local_318._0_4_ + local_318._0_4_;
          auVar127._4_4_ = local_318._4_4_ + local_318._4_4_;
          auVar127._8_4_ = local_318._8_4_ + local_318._8_4_;
          auVar127._12_4_ = local_318._12_4_ + local_318._12_4_;
          auVar77 = rcpps(auVar145,auVar127);
          fVar279 = auVar77._0_4_;
          fVar282 = auVar77._4_4_;
          fVar286 = auVar77._8_4_;
          fVar288 = auVar77._12_4_;
          fVar279 = ((float)DAT_01feca10 - auVar127._0_4_ * fVar279) * fVar279 + fVar279;
          fVar282 = (DAT_01feca10._4_4_ - auVar127._4_4_ * fVar282) * fVar282 + fVar282;
          fVar286 = (DAT_01feca10._8_4_ - auVar127._8_4_ * fVar286) * fVar286 + fVar286;
          fVar288 = (DAT_01feca10._12_4_ - auVar127._12_4_ * fVar288) * fVar288 + fVar288;
          fVar290 = (-fVar171 - auVar194._0_4_) * fVar279;
          fVar264 = (-fVar189 - auVar194._4_4_) * fVar282;
          fVar248 = (-fVar190 - auVar194._8_4_) * fVar286;
          fVar266 = (-fVar212 - auVar194._12_4_) * fVar288;
          fVar279 = (auVar194._0_4_ - fVar171) * fVar279;
          fVar282 = (auVar194._4_4_ - fVar189) * fVar282;
          fVar286 = (auVar194._8_4_ - fVar190) * fVar286;
          fVar288 = (auVar194._12_4_ - fVar212) * fVar288;
          fVar171 = (local_178._0_4_ * fVar290 + local_3b8) * (float)local_398._0_4_;
          fVar189 = (local_178._4_4_ * fVar264 + fStack_3b4) * (float)local_398._4_4_;
          fVar190 = (local_178._8_4_ * fVar248 + fStack_3b0) * fStack_390;
          fVar212 = (local_178._12_4_ * fVar266 + fStack_3ac) * fStack_38c;
          local_5c8._4_4_ = fStack_494 * fVar264 - (fVar169 * fVar189 + fVar301);
          local_5c8._0_4_ = local_498 * fVar290 - (fVar155 * fVar171 + fVar298);
          fStack_5c0 = fStack_490 * fVar248 - (fVar191 * fVar190 + fVar302);
          fStack_5bc = fStack_48c * fVar266 - (fVar201 * fVar212 + fVar303);
          local_5d8._4_4_ = fStack_534 * fVar264 - ((float)local_4b8._4_4_ * fVar189 + fVar247);
          local_5d8._0_4_ = local_538 * fVar290 - ((float)local_4b8._0_4_ * fVar171 + fVar238);
          fStack_5d0 = fStack_530 * fVar248 - (fStack_4b0 * fVar190 + fVar253);
          fStack_5cc = fStack_52c * fVar266 - (fStack_4ac * fVar212 + fVar255);
          local_558._4_4_ = fStack_4a4 * fVar264 - (fVar189 * fVar214 + fVar249);
          local_558._0_4_ = local_4a8 * fVar290 - (fVar171 * fVar213 + fVar246);
          fStack_550 = fStack_4a0 * fVar248 - (fVar190 * fVar236 + fVar254);
          fStack_54c = fStack_49c * fVar266 - (fVar212 * fVar237 + fVar263);
          local_398._0_4_ = (local_178._0_4_ * fVar279 + local_3b8) * (float)local_398._0_4_;
          local_398._4_4_ = (local_178._4_4_ * fVar282 + fStack_3b4) * (float)local_398._4_4_;
          fStack_390 = (local_178._8_4_ * fVar286 + fStack_3b0) * fStack_390;
          fStack_38c = (local_178._12_4_ * fVar288 + fStack_3ac) * fStack_38c;
          local_598._4_4_ = fStack_494 * fVar282 - (fVar169 * (float)local_398._4_4_ + fVar301);
          local_598._0_4_ = local_498 * fVar279 - (fVar155 * (float)local_398._0_4_ + fVar298);
          fStack_590 = fStack_490 * fVar286 - (fVar191 * fStack_390 + fVar302);
          fStack_58c = fStack_48c * fVar288 - (fVar201 * fStack_38c + fVar303);
          fVar171 = local_538 * fVar279 -
                    ((float)local_4b8._0_4_ * (float)local_398._0_4_ + fVar238);
          fVar189 = fStack_534 * fVar282 -
                    ((float)local_4b8._4_4_ * (float)local_398._4_4_ + fVar247);
          fVar190 = fStack_530 * fVar286 - (fStack_4b0 * fStack_390 + fVar253);
          fVar212 = fStack_52c * fVar288 - (fStack_4ac * fStack_38c + fVar255);
          bVar9 = 0.0 <= auVar145._0_4_;
          uVar58 = -(uint)bVar9;
          bVar10 = 0.0 <= auVar145._4_4_;
          uVar60 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar145._8_4_;
          uVar62 = -(uint)bVar11;
          bVar12 = 0.0 <= auVar145._12_4_;
          uVar64 = -(uint)bVar12;
          fVar155 = local_4a8 * fVar279 - ((float)local_398._0_4_ * fVar213 + fVar246);
          fVar169 = fStack_4a4 * fVar282 - ((float)local_398._4_4_ * fVar214 + fVar249);
          fVar191 = fStack_4a0 * fVar286 - (fStack_390 * fVar236 + fVar254);
          fVar201 = fStack_49c * fVar288 - (fStack_38c * fVar237 + fVar263);
          auVar210._0_4_ = (uint)fVar290 & uVar58;
          auVar210._4_4_ = (uint)fVar264 & uVar60;
          auVar210._8_4_ = (uint)fVar248 & uVar62;
          auVar210._12_4_ = (uint)fVar266 & uVar64;
          auVar98._0_8_ = CONCAT44(~uVar60,~uVar58) & 0x7f8000007f800000;
          auVar98._8_4_ = ~uVar62 & 0x7f800000;
          auVar98._12_4_ = ~uVar64 & 0x7f800000;
          auVar98 = auVar98 | auVar210;
          auVar245._0_4_ = (uint)fVar279 & uVar58;
          auVar245._4_4_ = (uint)fVar282 & uVar60;
          auVar245._8_4_ = (uint)fVar286 & uVar62;
          auVar245._12_4_ = (uint)fVar288 & uVar64;
          auVar211._0_8_ = CONCAT44(~uVar60,~uVar58) & 0xff800000ff800000;
          auVar211._8_4_ = ~uVar62 & 0xff800000;
          auVar211._12_4_ = ~uVar64 & 0xff800000;
          auVar211 = auVar211 | auVar245;
          auVar128._0_8_ = (ulong)local_3a8 & 0x7fffffff7fffffff;
          auVar128._8_4_ = ABS(fStack_3a0);
          auVar128._12_4_ = ABS(fStack_39c);
          auVar25._4_4_ = fStack_304;
          auVar25._0_4_ = local_308;
          auVar25._8_4_ = fStack_300;
          auVar25._12_4_ = fStack_2fc;
          auVar77 = maxps(auVar25,auVar128);
          fVar213 = auVar77._0_4_ * 1.9073486e-06;
          fVar214 = auVar77._4_4_ * 1.9073486e-06;
          fVar236 = auVar77._8_4_ * 1.9073486e-06;
          fVar237 = auVar77._12_4_ * 1.9073486e-06;
          auVar198._0_4_ = -(uint)(ABS(local_318._0_4_) < fVar213 && bVar9);
          auVar198._4_4_ = -(uint)(ABS(local_318._4_4_) < fVar214 && bVar10);
          auVar198._8_4_ = -(uint)(ABS(local_318._8_4_) < fVar236 && bVar11);
          auVar198._12_4_ = -(uint)(ABS(local_318._12_4_) < fVar237 && bVar12);
          iVar43 = movmskps(iVar43,auVar198);
          if (iVar43 != 0) {
            uVar58 = -(uint)(fVar157 <= 0.0);
            uVar60 = -(uint)(fVar170 <= 0.0);
            uVar62 = -(uint)(fVar200 <= 0.0);
            uVar64 = -(uint)(fVar202 <= 0.0);
            auVar261._0_4_ = (uVar58 & 0xff800000 | ~uVar58 & (uint)DAT_01feb9f0) & auVar198._0_4_;
            auVar261._4_4_ = (uVar60 & 0xff800000 | ~uVar60 & DAT_01feb9f0._4_4_) & auVar198._4_4_;
            auVar261._8_4_ = (uVar62 & 0xff800000 | ~uVar62 & DAT_01feb9f0._8_4_) & auVar198._8_4_;
            auVar261._12_4_ =
                 (uVar64 & 0xff800000 | ~uVar64 & DAT_01feb9f0._12_4_) & auVar198._12_4_;
            auVar252._0_4_ = ~auVar198._0_4_ & auVar98._0_4_;
            auVar252._4_4_ = ~auVar198._4_4_ & auVar98._4_4_;
            auVar252._8_4_ = ~auVar198._8_4_ & auVar98._8_4_;
            auVar252._12_4_ = ~auVar198._12_4_ & auVar98._12_4_;
            auVar98 = auVar252 | auVar261;
            auVar262._0_4_ = (uVar58 & (uint)DAT_01feb9f0 | ~uVar58 & 0xff800000) & auVar198._0_4_;
            auVar262._4_4_ = (uVar60 & DAT_01feb9f0._4_4_ | ~uVar60 & 0xff800000) & auVar198._4_4_;
            auVar262._8_4_ = (uVar62 & DAT_01feb9f0._8_4_ | ~uVar62 & 0xff800000) & auVar198._8_4_;
            auVar262._12_4_ =
                 (uVar64 & DAT_01feb9f0._12_4_ | ~uVar64 & 0xff800000) & auVar198._12_4_;
            auVar199._0_4_ = ~auVar198._0_4_ & auVar211._0_4_;
            auVar199._4_4_ = ~auVar198._4_4_ & auVar211._4_4_;
            auVar199._8_4_ = ~auVar198._8_4_ & auVar211._8_4_;
            auVar199._12_4_ = ~auVar198._12_4_ & auVar211._12_4_;
            auVar211 = auVar199 | auVar262;
            local_4c8._4_4_ = -(uint)((fVar214 <= ABS(local_318._4_4_) || fVar170 <= 0.0) && bVar10)
            ;
            local_4c8._0_4_ = -(uint)((fVar213 <= ABS(local_318._0_4_) || fVar157 <= 0.0) && bVar9);
            fStack_4c0 = (float)-(uint)((fVar236 <= ABS(local_318._8_4_) || fVar200 <= 0.0) &&
                                       bVar11);
            fStack_4bc = (float)-(uint)((fVar237 <= ABS(local_318._12_4_) || fVar202 <= 0.0) &&
                                       bVar12);
          }
        }
        fVar155 = fVar155 * local_4a8;
        fVar169 = fVar169 * fStack_4a4;
        fVar191 = fVar191 * fStack_4a0;
        fVar201 = fVar201 * fStack_49c;
        fVar171 = fVar171 * local_538;
        fVar189 = fVar189 * fStack_534;
        fVar190 = fVar190 * fStack_530;
        fVar212 = fVar212 * fStack_52c;
        fVar157 = (float)local_598._0_4_ * local_498;
        fVar170 = (float)local_598._4_4_ * fStack_494;
        fStack_590 = fStack_590 * fStack_490;
        fStack_58c = fStack_58c * fStack_48c;
        _local_118 = local_478;
        local_108 = minps(local_198,auVar98);
        _local_1a8 = maxps(local_478,auVar211);
        local_3c8._0_4_ = -(uint)(fVar268 <= local_108._0_4_) & auVar258._0_4_;
        local_3c8._4_4_ = -(uint)(fVar274 <= local_108._4_4_) & auVar258._4_4_;
        local_3c8._8_4_ = -(uint)(fVar276 <= local_108._8_4_) & auVar258._8_4_;
        local_3c8._12_4_ = -(uint)(fVar265 <= local_108._12_4_) & auVar258._12_4_;
        local_3d8._0_8_ =
             CONCAT44(-(uint)(local_1a8._4_4_ <= local_198._4_4_) & auVar258._4_4_,
                      -(uint)(local_1a8._0_4_ <= local_198._0_4_) & auVar258._0_4_);
        local_3d8._8_4_ = -(uint)(local_1a8._8_4_ <= local_198._8_4_) & auVar258._8_4_;
        local_3d8._12_4_ = -(uint)(local_1a8._12_4_ <= local_198._12_4_) & auVar258._12_4_;
        auVar99._8_4_ = local_3d8._8_4_;
        auVar99._0_8_ = local_3d8._0_8_;
        auVar99._12_4_ = local_3d8._12_4_;
        iVar43 = movmskps(iVar43,auVar99 | local_3c8);
        lVar46 = CONCAT44(uVar52,iVar43);
        if (iVar43 != 0) {
          _local_4b8 = _local_1a8;
          local_3b8 = (float)(int)local_560;
          fStack_3b4 = (float)(int)local_560;
          fStack_3b0 = (float)(int)local_560;
          fStack_3ac = (float)(int)local_560;
          local_558._0_4_ =
               -(uint)((int)local_560 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_558._0_4_ * local_4a8 +
                                                 (float)local_5d8._0_4_ * local_538 +
                                                 (float)local_5c8._0_4_ * local_498)) &
                             local_4c8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_558._4_4_ =
               -(uint)((int)local_560 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_558._4_4_ * fStack_4a4 +
                                                 (float)local_5d8._4_4_ * fStack_534 +
                                                 (float)local_5c8._4_4_ * fStack_494)) &
                             local_4c8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_550 = (float)-(uint)((int)local_560 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_550 * fStack_4a0 +
                                                                fStack_5d0 * fStack_530 +
                                                                fStack_5c0 * fStack_490)) &
                                            (uint)fStack_4c0) << 0x1f) >> 0x1f) + 4);
          fStack_54c = (float)-(uint)((int)local_560 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_54c * fStack_49c +
                                                                fStack_5cc * fStack_52c +
                                                                fStack_5bc * fStack_48c)) &
                                            (uint)fStack_4bc) << 0x1f) >> 0x1f) + 4);
          _local_398 = local_3c8;
          local_3c8 = ~_local_558 & local_3c8;
          iVar43 = movmskps(iVar43,local_3c8);
          _local_3a8 = local_3d8;
          if (iVar43 != 0) {
            local_488 = local_3f8 + fVar268;
            fStack_484 = fStack_3f4 + fVar274;
            fStack_480 = fStack_3f0 + fVar276;
            fStack_47c = fStack_3ec + fVar265;
            do {
              auVar194 = ~local_3c8 & _DAT_01feb9f0 | local_3c8 & local_478;
              auVar162._4_4_ = auVar194._0_4_;
              auVar162._0_4_ = auVar194._4_4_;
              auVar162._8_4_ = auVar194._12_4_;
              auVar162._12_4_ = auVar194._8_4_;
              auVar77 = minps(auVar162,auVar194);
              auVar129._0_8_ = auVar77._8_8_;
              auVar129._8_4_ = auVar77._0_4_;
              auVar129._12_4_ = auVar77._4_4_;
              auVar77 = minps(auVar129,auVar77);
              auVar130._0_8_ =
                   CONCAT44(-(uint)(auVar77._4_4_ == auVar194._4_4_) & local_3c8._4_4_,
                            -(uint)(auVar77._0_4_ == auVar194._0_4_) & local_3c8._0_4_);
              auVar130._8_4_ = -(uint)(auVar77._8_4_ == auVar194._8_4_) & local_3c8._8_4_;
              auVar130._12_4_ = -(uint)(auVar77._12_4_ == auVar194._12_4_) & local_3c8._12_4_;
              iVar43 = movmskps(iVar43,auVar130);
              auVar100 = local_3c8;
              if (iVar43 != 0) {
                auVar100._8_4_ = auVar130._8_4_;
                auVar100._0_8_ = auVar130._0_8_;
                auVar100._12_4_ = auVar130._12_4_;
              }
              uVar44 = movmskps(iVar43,auVar100);
              lVar46 = 0;
              if (CONCAT44(uVar52,uVar44) != 0) {
                for (; (CONCAT44(uVar52,uVar44) >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                }
              }
              *(undefined4 *)(local_3c8 + lVar46 * 4) = 0;
              fVar67 = local_358[lVar46];
              auVar259 = ZEXT416(*(uint *)(local_118 + lVar46 * 4));
              fVar68 = SQRT(fVar141);
              if ((float)local_408._0_4_ < 0.0) {
                fVar68 = sqrtf((float)local_408._0_4_);
                lVar46 = extraout_RAX;
              }
              auVar13._4_4_ = fVar116;
              auVar13._0_4_ = fVar115;
              auVar13._8_4_ = fVar118;
              auVar13._12_4_ = fVar139;
              auVar19._4_4_ = fStack_504;
              auVar19._0_4_ = local_508;
              auVar19._8_4_ = fStack_500;
              auVar19._12_4_ = fStack_4fc;
              auVar194 = minps(auVar13,auVar19);
              auVar195 = maxps(auVar13,auVar19);
              auVar17._4_4_ = fStack_514;
              auVar17._0_4_ = local_518;
              auVar17._8_4_ = fStack_510;
              auVar17._12_4_ = fStack_50c;
              auVar15._4_4_ = fStack_524;
              auVar15._0_4_ = local_528;
              auVar15._8_4_ = fStack_520;
              auVar15._12_4_ = fStack_51c;
              auVar77 = minps(auVar17,auVar15);
              auVar194 = minps(auVar194,auVar77);
              auVar77 = maxps(auVar17,auVar15);
              auVar77 = maxps(auVar195,auVar77);
              auVar180._0_8_ = auVar194._0_8_ & 0x7fffffff7fffffff;
              auVar180._8_4_ = auVar194._8_4_ & 0x7fffffff;
              auVar180._12_4_ = auVar194._12_4_ & 0x7fffffff;
              local_468 = auVar77._12_4_;
              auVar101._0_8_ = auVar77._0_8_ & 0x7fffffff7fffffff;
              auVar101._8_4_ = auVar77._8_4_ & 0x7fffffff;
              auVar101._12_4_ = ABS(local_468);
              auVar77 = maxps(auVar180,auVar101);
              uVar117 = auVar77._8_8_;
              fVar113 = auVar77._4_4_;
              if (auVar77._4_4_ <= auVar77._0_4_) {
                fVar113 = auVar77._0_4_;
              }
              auVar181._8_8_ = uVar117;
              auVar181._0_8_ = uVar117;
              if (auVar77._8_4_ <= fVar113) {
                auVar182._4_12_ = auVar181._4_12_;
                auVar182._0_4_ = fVar113;
                uVar117 = auVar182._0_8_;
              }
              fVar113 = (float)uVar117 * 1.9073486e-06;
              local_438 = fVar68 * 1.9073486e-06;
              fStack_464 = local_468;
              fStack_460 = local_468;
              fStack_45c = local_468;
              lVar57 = 5;
              do {
                fVar247 = auVar259._0_4_;
                fVar253 = 1.0 - fVar67;
                fVar249 = fVar67 * 3.0;
                fVar202 = -fVar67 * fVar253 * fVar253 * 0.5;
                fVar68 = (fVar67 * fVar67 * (fVar249 + -5.0) + 2.0) * 0.5;
                fVar114 = ((fVar253 * 3.0 + -5.0) * fVar253 * fVar253 + 2.0) * 0.5;
                fVar200 = -fVar253 * fVar67 * fVar67 * 0.5;
                local_428 = fVar202 * fVar115 +
                            fVar68 * local_508 + fVar114 * local_518 + fVar200 * local_528;
                fStack_424 = fVar202 * fVar116 +
                             fVar68 * fStack_504 + fVar114 * fStack_514 + fVar200 * fStack_524;
                fStack_420 = fVar202 * fVar118 +
                             fVar68 * fStack_500 + fVar114 * fStack_510 + fVar200 * fStack_520;
                fStack_41c = fVar202 * fVar139 +
                             fVar68 * fStack_4fc + fVar114 * fStack_50c + fVar200 * fStack_51c;
                fVar68 = fVar67 * -9.0 + 4.0;
                fVar114 = fVar249 + -1.0;
                fVar237 = (fVar247 * (float)local_3e8._0_4_ + 0.0) - local_428;
                fVar238 = (fVar247 * (float)local_3e8._4_4_ + 0.0) - fStack_424;
                fVar246 = (fVar247 * fStack_3e0 + 0.0) - fStack_420;
                fStack_5a4 = (fVar247 * fStack_3dc + 0.0) - fStack_41c;
                fVar200 = fVar238 * fVar238;
                fVar202 = fVar246 * fVar246;
                fVar213 = fStack_5a4 * fStack_5a4;
                fVar214 = fVar200 + fVar237 * fVar237 + fVar202;
                fVar236 = fVar200 + fVar200 + fVar213;
                fVar202 = fVar200 + fVar202 + fVar202;
                fVar213 = fVar200 + fVar213 + fVar213;
                local_448 = fVar214;
                if (fVar214 < 0.0) {
                  fStack_454 = 0.0;
                  fStack_450 = 0.0;
                  fStack_44c = 0.0;
                  local_458 = fVar253 * -2.0;
                  fVar254 = sqrtf(fVar214);
                  lVar46 = extraout_RAX_00;
                  fVar200 = local_458;
                }
                else {
                  fVar254 = SQRT(fVar214);
                  fVar200 = fVar253 * -2.0;
                }
                fVar263 = (fVar67 * (fVar253 + fVar253) - fVar253 * fVar253) * 0.5;
                fVar255 = ((fVar67 + fVar67) * (fVar249 + -5.0) + fVar67 * fVar249) * 0.5;
                fVar249 = ((fVar249 + 2.0) * (fVar253 + fVar253) + fVar253 * -3.0 * fVar253) * 0.5;
                fVar200 = (fVar200 * fVar67 + fVar67 * fVar67) * 0.5;
                fVar265 = fVar263 * fVar115 +
                          fVar255 * local_508 + fVar249 * local_518 + fVar200 * local_528;
                fVar268 = fVar263 * fVar116 +
                          fVar255 * fStack_504 + fVar249 * fStack_514 + fVar200 * fStack_524;
                fVar274 = fVar263 * fVar118 +
                          fVar255 * fStack_500 + fVar249 * fStack_510 + fVar200 * fStack_520;
                fVar255 = fVar263 * fVar139 +
                          fVar255 * fStack_4fc + fVar249 * fStack_50c + fVar200 * fStack_51c;
                fVar200 = fVar67 * -3.0 + 2.0;
                fVar263 = fVar67 * 9.0 + -5.0;
                fVar249 = fVar200 * fVar115 +
                          fVar263 * local_508 + fVar68 * local_518 + fVar114 * local_528;
                fVar253 = fVar200 * fVar116 +
                          fVar263 * fStack_504 + fVar68 * fStack_514 + fVar114 * fStack_524;
                fVar114 = fVar200 * fVar118 +
                          fVar263 * fStack_500 + fVar68 * fStack_510 + fVar114 * fStack_520;
                fVar68 = fVar113;
                if (fVar113 <= local_438 * fVar247) {
                  fVar68 = local_438 * fVar247;
                }
                fVar200 = fVar268 * fVar268 + fVar265 * fVar265 + fVar274 * fVar274;
                auVar194 = ZEXT416((uint)fVar200);
                auVar77 = rsqrtss(ZEXT416((uint)fVar200),auVar194);
                fVar263 = auVar77._0_4_;
                fVar276 = fVar263 * fVar263 * fVar200 * -0.5 * fVar263 + fVar263 * 1.5;
                fVar263 = fVar114 * fVar274 + fVar253 * fVar268 + fVar249 * fVar265;
                auVar77 = rcpss(auVar194,auVar194);
                fVar290 = (2.0 - fVar200 * auVar77._0_4_) * auVar77._0_4_;
                fVar279 = fVar265 * fVar276;
                fVar282 = fVar268 * fVar276;
                fVar286 = fVar274 * fVar276;
                fVar288 = fVar255 * fVar276;
                local_638._0_4_ = -fVar265;
                local_638._4_4_ = -fVar268;
                if (fVar200 < 0.0) {
                  local_638 = CONCAT44(fVar268,fVar265) ^ 0x8000000080000000;
                  fVar264 = sqrtf(fVar200);
                  lVar46 = extraout_RAX_01;
                }
                else {
                  fVar264 = SQRT(fVar200);
                }
                fVar248 = fVar238 * fVar282;
                fVar266 = fVar246 * fVar286;
                fVar267 = fStack_5a4 * fVar288;
                fVar275 = fVar248 + fVar237 * fVar279 + fVar266;
                fVar277 = fVar248 + fVar248 + fVar267;
                fVar266 = fVar248 + fVar266 + fVar266;
                fVar267 = fVar248 + fVar267 + fVar267;
                fVar254 = (fVar254 + 1.0) * (fVar113 / fVar264) + fVar254 * fVar113 + fVar68;
                fVar264 = fStack_3dc * fVar288;
                fVar253 = fVar286 * -fVar274 +
                          fVar282 * local_638._4_4_ + fVar279 * (float)local_638 +
                          fVar290 * (fVar200 * fVar114 - fVar263 * fVar274) * fVar276 * fVar246 +
                          fVar290 * (fVar200 * fVar253 - fVar263 * fVar268) * fVar276 * fVar238 +
                          fVar290 * (fVar200 * fVar249 - fVar263 * fVar265) * fVar276 * fVar237;
                fVar263 = fStack_3e0 * fVar286 +
                          (float)local_3e8._4_4_ * fVar282 + (float)local_3e8._0_4_ * fVar279;
                fVar114 = fVar214 - fVar275 * fVar275;
                auVar102._0_8_ = CONCAT44(fVar236 - fVar277 * fVar277,fVar114);
                auVar102._8_4_ = fVar202 - fVar266 * fVar266;
                auVar102._12_4_ = fVar213 - fVar267 * fVar267;
                fVar249 = -fVar255 * fStack_5a4;
                fStack_5a4 = fStack_3dc * fStack_5a4;
                local_5a8 = (fStack_3e0 * fVar246 +
                            (float)local_3e8._4_4_ * fVar238 + (float)local_3e8._0_4_ * fVar237) -
                            fVar275 * fVar263;
                fStack_5a0 = fStack_3e0 * fVar246;
                fStack_59c = fStack_5a4;
                auVar163._8_4_ = auVar102._8_4_;
                auVar163._0_8_ = auVar102._0_8_;
                auVar163._12_4_ = auVar102._12_4_;
                auVar77 = rsqrtss(auVar163,auVar102);
                fVar200 = auVar77._0_4_;
                fVar200 = fVar200 * fVar200 * fVar114 * -0.5 * fVar200 + fVar200 * 1.5;
                if (fVar114 < 0.0) {
                  fVar114 = sqrtf(fVar114);
                  lVar46 = extraout_RAX_02;
                }
                else {
                  fVar114 = SQRT(fVar114);
                }
                auVar183._4_4_ = fVar236;
                auVar183._0_4_ = fVar214;
                auVar183._8_4_ = fVar202;
                auVar183._12_4_ = fVar213;
                fVar114 = fVar114 - fStack_41c;
                fVar202 = ((-fVar274 * fVar246 +
                           local_638._4_4_ * fVar238 + (float)local_638 * fVar237) -
                          fVar275 * fVar253) * fVar200 - fVar255;
                auVar146._4_12_ = local_5a8._4_12_;
                auVar146._0_4_ = local_5a8 * fVar200;
                auVar233._0_8_ = CONCAT44(fVar249,fVar202) ^ 0x8000000080000000;
                auVar233._8_4_ = -fVar249;
                auVar233._12_4_ = fVar288 * -fVar255;
                auVar232._8_8_ = auVar233._8_8_;
                auVar232._0_8_ = CONCAT44(fVar253,fVar202) ^ 0x80000000;
                auVar164._0_4_ = fVar253 * auVar146._0_4_ - fVar263 * fVar202;
                auVar148._0_8_ = auVar146._0_8_;
                auVar148._8_4_ = fStack_5a4;
                auVar148._12_4_ = -fVar264;
                auVar147._8_8_ = auVar148._8_8_;
                auVar147._0_8_ = CONCAT44(fVar263,auVar146._0_4_) ^ 0x8000000000000000;
                auVar164._4_4_ = auVar164._0_4_;
                auVar164._8_4_ = auVar164._0_4_;
                auVar164._12_4_ = auVar164._0_4_;
                auVar77 = divps(auVar147,auVar164);
                auVar194 = divps(auVar232,auVar164);
                fVar67 = fVar67 - (auVar77._4_4_ * fVar114 + auVar77._0_4_ * fVar275);
                auVar259._0_4_ = fVar247 - (auVar194._4_4_ * fVar114 + auVar194._0_4_ * fVar275);
                lVar46 = CONCAT71((int7)((ulong)lVar46 >> 8),1);
                if ((ABS(fVar275) < fVar254) &&
                   (ABS(fVar114) < local_468 * 1.9073486e-06 + fVar68 + fVar254)) {
                  auVar259._0_4_ = auVar259._0_4_ + (float)local_378._0_4_;
                  if ((auVar259._0_4_ < fVar156) ||
                     (fVar68 = *(float *)(ray + k * 4 + 0x80), fVar68 < auVar259._0_4_)) {
                    lVar46 = 0;
                    unaff_BPL = 0;
                  }
                  else {
                    if ((0.0 <= fVar67) && (fVar67 <= 1.0)) {
                      auVar77 = rsqrtss(auVar183,auVar183);
                      fVar114 = auVar77._0_4_;
                      pGVar7 = (context->scene->geometries).items[local_568].ptr;
                      if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_BPL = true;
                        }
                        else {
                          fVar114 = fVar114 * 1.5 + fVar114 * fVar114 * local_448 * -0.5 * fVar114;
                          fVar237 = fVar237 * fVar114;
                          fVar238 = fVar238 * fVar114;
                          fVar246 = fVar246 * fVar114;
                          fVar114 = fVar255 * fVar237 + fVar265;
                          fVar200 = fVar255 * fVar238 + fVar268;
                          fVar202 = fVar255 * fVar246 + fVar274;
                          fVar213 = fVar238 * fVar265 - fVar268 * fVar237;
                          fVar214 = fVar246 * fVar268 - fVar274 * fVar238;
                          fVar236 = fVar237 * fVar274 - fVar265 * fVar246;
                          local_218 = fVar214 * fVar200 - fVar236 * fVar114;
                          local_238._4_4_ = fVar236 * fVar202 - fVar213 * fVar200;
                          local_228 = fVar213 * fVar114 - fVar214 * fVar202;
                          local_238._0_4_ = local_238._4_4_;
                          fStack_230 = (float)local_238._4_4_;
                          fStack_22c = (float)local_238._4_4_;
                          fStack_224 = local_228;
                          fStack_220 = local_228;
                          fStack_21c = local_228;
                          fStack_214 = local_218;
                          fStack_210 = local_218;
                          fStack_20c = local_218;
                          local_208 = fVar67;
                          fStack_204 = fVar67;
                          fStack_200 = fVar67;
                          fStack_1fc = fVar67;
                          local_1f8 = 0;
                          uStack_1f0 = 0;
                          local_1e8 = CONCAT44(uStack_334,local_338);
                          uStack_1e0 = CONCAT44(uStack_32c,uStack_330);
                          local_1d8 = CONCAT44(uStack_324,local_328);
                          uStack_1d0 = CONCAT44(uStack_31c,uStack_320);
                          local_1c8 = context->user->instID[0];
                          uStack_1c4 = local_1c8;
                          uStack_1c0 = local_1c8;
                          uStack_1bc = local_1c8;
                          local_1b8 = context->user->instPrimID[0];
                          uStack_1b4 = local_1b8;
                          uStack_1b0 = local_1b8;
                          uStack_1ac = local_1b8;
                          *(float *)(ray + k * 4 + 0x80) = auVar259._0_4_;
                          local_578 = *local_418;
                          uStack_570 = local_418[1];
                          local_4f8 = (undefined1  [8])&local_578;
                          uStack_4f0 = pGVar7->userPtr;
                          local_4e8 = context->user;
                          local_4e0 = ray;
                          local_4d8 = (RTCHitN *)local_238;
                          local_4d0 = 4;
                          p_Var48 = pGVar7->occlusionFilterN;
                          if (p_Var48 != (RTCFilterFunctionN)0x0) {
                            pRVar54 = (RTCFilterFunctionNArguments *)local_4f8;
                            p_Var48 = (RTCFilterFunctionN)(*p_Var48)(pRVar54);
                          }
                          auVar103._0_4_ = -(uint)((int)local_578 == 0);
                          auVar103._4_4_ = -(uint)(local_578._4_4_ == 0);
                          auVar103._8_4_ = -(uint)((int)uStack_570 == 0);
                          auVar103._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                          uVar58 = movmskps((int)p_Var48,auVar103);
                          pRVar47 = (RayK<4> *)(ulong)(uVar58 ^ 0xf);
                          if ((uVar58 ^ 0xf) == 0) {
                            auVar103 = auVar103 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var48 = context->args->filter;
                            if ((p_Var48 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                              pRVar54 = (RTCFilterFunctionNArguments *)local_4f8;
                              (*p_Var48)(pRVar54);
                            }
                            auVar131._0_4_ = -(uint)((int)local_578 == 0);
                            auVar131._4_4_ = -(uint)(local_578._4_4_ == 0);
                            auVar131._8_4_ = -(uint)((int)uStack_570 == 0);
                            auVar131._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                            auVar103 = auVar131 ^ _DAT_01febe20;
                            *(undefined1 (*) [16])(local_4e0 + 0x80) =
                                 ~auVar131 & _DAT_01feba00 |
                                 *(undefined1 (*) [16])(local_4e0 + 0x80) & auVar131;
                            pRVar47 = local_4e0;
                          }
                          auVar104._0_4_ = auVar103._0_4_ << 0x1f;
                          auVar104._4_4_ = auVar103._4_4_ << 0x1f;
                          auVar104._8_4_ = auVar103._8_4_ << 0x1f;
                          auVar104._12_4_ = auVar103._12_4_ << 0x1f;
                          iVar43 = movmskps((int)pRVar47,auVar104);
                          unaff_BPL = iVar43 != 0;
                          if (!(bool)unaff_BPL) {
                            *(float *)(ray + k * 4 + 0x80) = fVar68;
                          }
                        }
                        lVar46 = 0;
                        goto LAB_00b60099;
                      }
                    }
                    lVar46 = 0;
                    unaff_BPL = 0;
                  }
                }
LAB_00b60099:
                if ((char)lVar46 == '\0') goto LAB_00b603ce;
                lVar57 = lVar57 + -1;
              } while (lVar57 != 0);
              unaff_BPL = 0;
LAB_00b603ce:
              unaff_BPL = unaff_BPL & 1;
              fVar67 = *(float *)(ray + k * 4 + 0x80);
              local_3c8._0_4_ = -(uint)(local_488 <= fVar67) & local_3c8._0_4_;
              local_3c8._4_4_ = -(uint)(fStack_484 <= fVar67) & local_3c8._4_4_;
              local_3c8._8_4_ = -(uint)(fStack_480 <= fVar67) & local_3c8._8_4_;
              local_3c8._12_4_ = -(uint)(fStack_47c <= fVar67) & local_3c8._12_4_;
              bVar55 = bVar55 | unaff_BPL;
              uVar52 = (undefined4)((ulong)lVar46 >> 0x20);
              iVar43 = movmskps((int)lVar46,local_3c8);
            } while (iVar43 != 0);
          }
          fVar67 = *(float *)(ray + k * 4 + 0x80);
          local_4b8._0_4_ = -(uint)((float)local_4b8._0_4_ + local_3f8 <= fVar67) & local_3a8._0_4_;
          local_4b8._4_4_ = -(uint)((float)local_4b8._4_4_ + fStack_3f4 <= fVar67) & local_3a8._4_4_
          ;
          fStack_4b0 = (float)(-(uint)(fStack_4b0 + fStack_3f0 <= fVar67) & (uint)fStack_3a0);
          fStack_4ac = (float)(-(uint)(fStack_4ac + fStack_3ec <= fVar67) & (uint)fStack_39c);
          auVar149._0_4_ =
               -(uint)((int)local_3b8 <
                      ((int)((-(uint)(0.3 <= ABS(fVar157 + fVar171 + fVar155)) & local_4c8._0_4_) <<
                            0x1f) >> 0x1f) + 4);
          auVar149._4_4_ =
               -(uint)((int)fStack_3b4 <
                      ((int)((-(uint)(0.3 <= ABS(fVar170 + fVar189 + fVar169)) & local_4c8._4_4_) <<
                            0x1f) >> 0x1f) + 4);
          auVar149._8_4_ =
               -(uint)((int)fStack_3b0 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_590 + fVar190 + fVar191)) & (uint)fStack_4c0
                             ) << 0x1f) >> 0x1f) + 4);
          auVar149._12_4_ =
               -(uint)((int)fStack_3ac <
                      ((int)((-(uint)(0.3 <= ABS(fStack_58c + fVar212 + fVar201)) & (uint)fStack_4bc
                             ) << 0x1f) >> 0x1f) + 4);
          local_3d8 = ~auVar149 & _local_4b8;
          iVar43 = movmskps(iVar43,local_3d8);
          if (iVar43 != 0) {
            local_478 = _local_1a8;
            local_488 = local_3f8 + (float)local_1a8._0_4_;
            fStack_484 = fStack_3f4 + (float)local_1a8._4_4_;
            fStack_480 = fStack_3f0 + fStack_1a0;
            fStack_47c = fStack_3ec + fStack_19c;
            do {
              auVar194 = ~local_3d8 & _DAT_01feb9f0 | local_3d8 & local_478;
              auVar165._4_4_ = auVar194._0_4_;
              auVar165._0_4_ = auVar194._4_4_;
              auVar165._8_4_ = auVar194._12_4_;
              auVar165._12_4_ = auVar194._8_4_;
              auVar77 = minps(auVar165,auVar194);
              auVar132._0_8_ = auVar77._8_8_;
              auVar132._8_4_ = auVar77._0_4_;
              auVar132._12_4_ = auVar77._4_4_;
              auVar77 = minps(auVar132,auVar77);
              auVar133._0_8_ =
                   CONCAT44(-(uint)(auVar77._4_4_ == auVar194._4_4_) & local_3d8._4_4_,
                            -(uint)(auVar77._0_4_ == auVar194._0_4_) & local_3d8._0_4_);
              auVar133._8_4_ = -(uint)(auVar77._8_4_ == auVar194._8_4_) & local_3d8._8_4_;
              auVar133._12_4_ = -(uint)(auVar77._12_4_ == auVar194._12_4_) & local_3d8._12_4_;
              iVar43 = movmskps(iVar43,auVar133);
              auVar105 = local_3d8;
              if (iVar43 != 0) {
                auVar105._8_4_ = auVar133._8_4_;
                auVar105._0_8_ = auVar133._0_8_;
                auVar105._12_4_ = auVar133._12_4_;
              }
              uVar44 = movmskps(iVar43,auVar105);
              lVar46 = 0;
              if (CONCAT44(uVar52,uVar44) != 0) {
                for (; (CONCAT44(uVar52,uVar44) >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                }
              }
              *(undefined4 *)(local_3d8 + lVar46 * 4) = 0;
              fVar67 = local_368[lVar46];
              auVar260 = ZEXT416(*(uint *)(local_198 + lVar46 * 4));
              fVar68 = SQRT(fVar141);
              if ((float)local_408._0_4_ < 0.0) {
                fVar68 = sqrtf((float)local_408._0_4_);
                lVar46 = extraout_RAX_03;
              }
              auVar14._4_4_ = fVar116;
              auVar14._0_4_ = fVar115;
              auVar14._8_4_ = fVar118;
              auVar14._12_4_ = fVar139;
              auVar20._4_4_ = fStack_504;
              auVar20._0_4_ = local_508;
              auVar20._8_4_ = fStack_500;
              auVar20._12_4_ = fStack_4fc;
              auVar194 = minps(auVar14,auVar20);
              auVar195 = maxps(auVar14,auVar20);
              auVar18._4_4_ = fStack_514;
              auVar18._0_4_ = local_518;
              auVar18._8_4_ = fStack_510;
              auVar18._12_4_ = fStack_50c;
              auVar16._4_4_ = fStack_524;
              auVar16._0_4_ = local_528;
              auVar16._8_4_ = fStack_520;
              auVar16._12_4_ = fStack_51c;
              auVar77 = minps(auVar18,auVar16);
              auVar194 = minps(auVar194,auVar77);
              auVar77 = maxps(auVar18,auVar16);
              auVar77 = maxps(auVar195,auVar77);
              auVar184._0_8_ = auVar194._0_8_ & 0x7fffffff7fffffff;
              auVar184._8_4_ = auVar194._8_4_ & 0x7fffffff;
              auVar184._12_4_ = auVar194._12_4_ & 0x7fffffff;
              local_468 = auVar77._12_4_;
              auVar106._0_8_ = auVar77._0_8_ & 0x7fffffff7fffffff;
              auVar106._8_4_ = auVar77._8_4_ & 0x7fffffff;
              auVar106._12_4_ = ABS(local_468);
              auVar77 = maxps(auVar184,auVar106);
              uVar117 = auVar77._8_8_;
              fVar113 = auVar77._4_4_;
              if (auVar77._4_4_ <= auVar77._0_4_) {
                fVar113 = auVar77._0_4_;
              }
              auVar185._8_8_ = uVar117;
              auVar185._0_8_ = uVar117;
              if (auVar77._8_4_ <= fVar113) {
                auVar186._4_12_ = auVar185._4_12_;
                auVar186._0_4_ = fVar113;
                uVar117 = auVar186._0_8_;
              }
              fVar113 = (float)uVar117 * 1.9073486e-06;
              local_438 = fVar68 * 1.9073486e-06;
              fStack_464 = local_468;
              fStack_460 = local_468;
              fStack_45c = local_468;
              lVar57 = 5;
              do {
                fVar171 = auVar260._0_4_;
                fVar190 = 1.0 - fVar67;
                fVar189 = fVar67 * 3.0;
                fVar157 = -fVar67 * fVar190 * fVar190 * 0.5;
                fVar68 = (fVar67 * fVar67 * (fVar189 + -5.0) + 2.0) * 0.5;
                fVar114 = ((fVar190 * 3.0 + -5.0) * fVar190 * fVar190 + 2.0) * 0.5;
                fVar155 = -fVar190 * fVar67 * fVar67 * 0.5;
                local_428 = fVar157 * fVar115 +
                            fVar68 * local_508 + fVar114 * local_518 + fVar155 * local_528;
                fStack_424 = fVar157 * fVar116 +
                             fVar68 * fStack_504 + fVar114 * fStack_514 + fVar155 * fStack_524;
                fStack_420 = fVar157 * fVar118 +
                             fVar68 * fStack_500 + fVar114 * fStack_510 + fVar155 * fStack_520;
                fStack_41c = fVar157 * fVar139 +
                             fVar68 * fStack_4fc + fVar114 * fStack_50c + fVar155 * fStack_51c;
                fVar68 = fVar67 * -9.0 + 4.0;
                fVar114 = fVar189 + -1.0;
                fVar200 = (fVar171 * (float)local_3e8._0_4_ + 0.0) - local_428;
                fVar201 = (fVar171 * (float)local_3e8._4_4_ + 0.0) - fStack_424;
                fVar202 = (fVar171 * fStack_3e0 + 0.0) - fStack_420;
                fStack_5a4 = (fVar171 * fStack_3dc + 0.0) - fStack_41c;
                fVar155 = fVar201 * fVar201;
                fVar157 = fVar202 * fVar202;
                fVar169 = fStack_5a4 * fStack_5a4;
                fVar170 = fVar155 + fVar200 * fVar200 + fVar157;
                fVar191 = fVar155 + fVar155 + fVar169;
                fVar157 = fVar155 + fVar157 + fVar157;
                fVar169 = fVar155 + fVar169 + fVar169;
                local_448 = fVar170;
                if (fVar170 < 0.0) {
                  fStack_454 = 0.0;
                  fStack_450 = 0.0;
                  fStack_44c = 0.0;
                  local_458 = fVar190 * -2.0;
                  fVar212 = sqrtf(fVar170);
                  lVar46 = extraout_RAX_04;
                  fVar155 = local_458;
                }
                else {
                  fVar212 = SQRT(fVar170);
                  fVar155 = fVar190 * -2.0;
                }
                fVar214 = (fVar67 * (fVar190 + fVar190) - fVar190 * fVar190) * 0.5;
                fVar213 = ((fVar67 + fVar67) * (fVar189 + -5.0) + fVar67 * fVar189) * 0.5;
                fVar189 = ((fVar189 + 2.0) * (fVar190 + fVar190) + fVar190 * -3.0 * fVar190) * 0.5;
                fVar155 = (fVar155 * fVar67 + fVar67 * fVar67) * 0.5;
                fVar236 = fVar214 * fVar115 +
                          fVar213 * local_508 + fVar189 * local_518 + fVar155 * local_528;
                fVar237 = fVar214 * fVar116 +
                          fVar213 * fStack_504 + fVar189 * fStack_514 + fVar155 * fStack_524;
                fVar238 = fVar214 * fVar118 +
                          fVar213 * fStack_500 + fVar189 * fStack_510 + fVar155 * fStack_520;
                fVar213 = fVar214 * fVar139 +
                          fVar213 * fStack_4fc + fVar189 * fStack_50c + fVar155 * fStack_51c;
                fVar155 = fVar67 * -3.0 + 2.0;
                fVar214 = fVar67 * 9.0 + -5.0;
                fVar189 = fVar155 * fVar115 +
                          fVar214 * local_508 + fVar68 * local_518 + fVar114 * local_528;
                fVar190 = fVar155 * fVar116 +
                          fVar214 * fStack_504 + fVar68 * fStack_514 + fVar114 * fStack_524;
                fVar114 = fVar155 * fVar118 +
                          fVar214 * fStack_500 + fVar68 * fStack_510 + fVar114 * fStack_520;
                fVar68 = fVar113;
                if (fVar113 <= local_438 * fVar171) {
                  fVar68 = local_438 * fVar171;
                }
                fVar155 = fVar237 * fVar237 + fVar236 * fVar236 + fVar238 * fVar238;
                auVar194 = ZEXT416((uint)fVar155);
                auVar77 = rsqrtss(ZEXT416((uint)fVar155),auVar194);
                fVar214 = auVar77._0_4_;
                fVar246 = fVar214 * fVar214 * fVar155 * -0.5 * fVar214 + fVar214 * 1.5;
                fVar214 = fVar114 * fVar238 + fVar190 * fVar237 + fVar189 * fVar236;
                auVar77 = rcpss(auVar194,auVar194);
                fVar255 = (2.0 - fVar155 * auVar77._0_4_) * auVar77._0_4_;
                fVar247 = fVar236 * fVar246;
                fVar249 = fVar237 * fVar246;
                fVar253 = fVar238 * fVar246;
                fVar254 = fVar213 * fVar246;
                local_638._0_4_ = -fVar236;
                local_638._4_4_ = -fVar237;
                if (fVar155 < 0.0) {
                  local_638 = CONCAT44(fVar237,fVar236) ^ 0x8000000080000000;
                  fVar263 = sqrtf(fVar155);
                  lVar46 = extraout_RAX_05;
                }
                else {
                  fVar263 = SQRT(fVar155);
                }
                fVar265 = fVar201 * fVar249;
                fVar268 = fVar202 * fVar253;
                fVar274 = fStack_5a4 * fVar254;
                fVar276 = fVar265 + fVar200 * fVar247 + fVar268;
                fVar279 = fVar265 + fVar265 + fVar274;
                fVar268 = fVar265 + fVar268 + fVar268;
                fVar274 = fVar265 + fVar274 + fVar274;
                fVar212 = (fVar212 + 1.0) * (fVar113 / fVar263) + fVar212 * fVar113 + fVar68;
                fVar263 = fStack_3dc * fVar254;
                fVar190 = fVar253 * -fVar238 +
                          fVar249 * local_638._4_4_ + fVar247 * (float)local_638 +
                          fVar255 * (fVar155 * fVar114 - fVar214 * fVar238) * fVar246 * fVar202 +
                          fVar255 * (fVar155 * fVar190 - fVar214 * fVar237) * fVar246 * fVar201 +
                          fVar255 * (fVar155 * fVar189 - fVar214 * fVar236) * fVar246 * fVar200;
                fVar214 = fStack_3e0 * fVar253 +
                          (float)local_3e8._4_4_ * fVar249 + (float)local_3e8._0_4_ * fVar247;
                fVar114 = fVar170 - fVar276 * fVar276;
                auVar107._0_8_ = CONCAT44(fVar191 - fVar279 * fVar279,fVar114);
                auVar107._8_4_ = fVar157 - fVar268 * fVar268;
                auVar107._12_4_ = fVar169 - fVar274 * fVar274;
                fVar189 = -fVar213 * fStack_5a4;
                fStack_5a4 = fStack_3dc * fStack_5a4;
                local_5a8 = (fStack_3e0 * fVar202 +
                            (float)local_3e8._4_4_ * fVar201 + (float)local_3e8._0_4_ * fVar200) -
                            fVar276 * fVar214;
                fStack_5a0 = fStack_3e0 * fVar202;
                fStack_59c = fStack_5a4;
                auVar166._8_4_ = auVar107._8_4_;
                auVar166._0_8_ = auVar107._0_8_;
                auVar166._12_4_ = auVar107._12_4_;
                auVar77 = rsqrtss(auVar166,auVar107);
                fVar155 = auVar77._0_4_;
                fVar155 = fVar155 * fVar155 * fVar114 * -0.5 * fVar155 + fVar155 * 1.5;
                if (fVar114 < 0.0) {
                  fVar114 = sqrtf(fVar114);
                  lVar46 = extraout_RAX_06;
                }
                else {
                  fVar114 = SQRT(fVar114);
                }
                auVar187._4_4_ = fVar191;
                auVar187._0_4_ = fVar170;
                auVar187._8_4_ = fVar157;
                auVar187._12_4_ = fVar169;
                fVar114 = fVar114 - fStack_41c;
                fVar157 = ((-fVar238 * fVar202 +
                           local_638._4_4_ * fVar201 + (float)local_638 * fVar200) -
                          fVar276 * fVar190) * fVar155 - fVar213;
                auVar150._4_12_ = local_5a8._4_12_;
                auVar150._0_4_ = local_5a8 * fVar155;
                auVar235._0_8_ = CONCAT44(fVar189,fVar157) ^ 0x8000000080000000;
                auVar235._8_4_ = -fVar189;
                auVar235._12_4_ = fVar254 * -fVar213;
                auVar234._8_8_ = auVar235._8_8_;
                auVar234._0_8_ = CONCAT44(fVar190,fVar157) ^ 0x80000000;
                auVar167._0_4_ = fVar190 * auVar150._0_4_ - fVar214 * fVar157;
                auVar152._0_8_ = auVar150._0_8_;
                auVar152._8_4_ = fStack_5a4;
                auVar152._12_4_ = -fVar263;
                auVar151._8_8_ = auVar152._8_8_;
                auVar151._0_8_ = CONCAT44(fVar214,auVar150._0_4_) ^ 0x8000000000000000;
                auVar167._4_4_ = auVar167._0_4_;
                auVar167._8_4_ = auVar167._0_4_;
                auVar167._12_4_ = auVar167._0_4_;
                auVar77 = divps(auVar151,auVar167);
                auVar194 = divps(auVar234,auVar167);
                fVar67 = fVar67 - (auVar77._4_4_ * fVar114 + auVar77._0_4_ * fVar276);
                auVar260._0_4_ = fVar171 - (auVar194._4_4_ * fVar114 + auVar194._0_4_ * fVar276);
                lVar46 = CONCAT71((int7)((ulong)lVar46 >> 8),1);
                if ((ABS(fVar276) < fVar212) &&
                   (ABS(fVar114) < local_468 * 1.9073486e-06 + fVar68 + fVar212)) {
                  auVar260._0_4_ = auVar260._0_4_ + (float)local_378._0_4_;
                  if ((fVar156 <= auVar260._0_4_) &&
                     (((fVar68 = *(float *)(ray + k * 4 + 0x80), auVar260._0_4_ <= fVar68 &&
                       (0.0 <= fVar67)) && (fVar67 <= 1.0)))) {
                    auVar77 = rsqrtss(auVar187,auVar187);
                    fVar114 = auVar77._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_568].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_BPL = true;
                      }
                      else {
                        fVar114 = fVar114 * 1.5 + fVar114 * fVar114 * local_448 * -0.5 * fVar114;
                        fVar200 = fVar200 * fVar114;
                        fVar201 = fVar201 * fVar114;
                        fVar202 = fVar202 * fVar114;
                        fVar114 = fVar213 * fVar200 + fVar236;
                        fVar155 = fVar213 * fVar201 + fVar237;
                        fVar157 = fVar213 * fVar202 + fVar238;
                        fVar169 = fVar201 * fVar236 - fVar237 * fVar200;
                        fVar170 = fVar202 * fVar237 - fVar238 * fVar201;
                        fVar191 = fVar200 * fVar238 - fVar236 * fVar202;
                        local_218 = fVar170 * fVar155 - fVar191 * fVar114;
                        local_238._4_4_ = fVar191 * fVar157 - fVar169 * fVar155;
                        local_228 = fVar169 * fVar114 - fVar170 * fVar157;
                        local_238._0_4_ = local_238._4_4_;
                        fStack_230 = (float)local_238._4_4_;
                        fStack_22c = (float)local_238._4_4_;
                        fStack_224 = local_228;
                        fStack_220 = local_228;
                        fStack_21c = local_228;
                        fStack_214 = local_218;
                        fStack_210 = local_218;
                        fStack_20c = local_218;
                        local_208 = fVar67;
                        fStack_204 = fVar67;
                        fStack_200 = fVar67;
                        fStack_1fc = fVar67;
                        local_1f8 = 0;
                        uStack_1f0 = 0;
                        local_1e8 = CONCAT44(uStack_334,local_338);
                        uStack_1e0 = CONCAT44(uStack_32c,uStack_330);
                        local_1d8 = CONCAT44(uStack_324,local_328);
                        uStack_1d0 = CONCAT44(uStack_31c,uStack_320);
                        local_1c8 = context->user->instID[0];
                        uStack_1c4 = local_1c8;
                        uStack_1c0 = local_1c8;
                        uStack_1bc = local_1c8;
                        local_1b8 = context->user->instPrimID[0];
                        uStack_1b4 = local_1b8;
                        uStack_1b0 = local_1b8;
                        uStack_1ac = local_1b8;
                        *(float *)(ray + k * 4 + 0x80) = auVar260._0_4_;
                        local_578 = *local_418;
                        uStack_570 = local_418[1];
                        local_4f8 = (undefined1  [8])&local_578;
                        uStack_4f0 = pGVar7->userPtr;
                        local_4e8 = context->user;
                        local_4e0 = ray;
                        local_4d8 = (RTCHitN *)local_238;
                        local_4d0 = 4;
                        p_Var48 = pGVar7->occlusionFilterN;
                        if (p_Var48 != (RTCFilterFunctionN)0x0) {
                          pRVar54 = (RTCFilterFunctionNArguments *)local_4f8;
                          p_Var48 = (RTCFilterFunctionN)(*p_Var48)(pRVar54);
                        }
                        auVar108._0_4_ = -(uint)((int)local_578 == 0);
                        auVar108._4_4_ = -(uint)(local_578._4_4_ == 0);
                        auVar108._8_4_ = -(uint)((int)uStack_570 == 0);
                        auVar108._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                        uVar58 = movmskps((int)p_Var48,auVar108);
                        pRVar47 = (RayK<4> *)(ulong)(uVar58 ^ 0xf);
                        if ((uVar58 ^ 0xf) == 0) {
                          auVar108 = auVar108 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var48 = context->args->filter;
                          if ((p_Var48 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar54 = (RTCFilterFunctionNArguments *)local_4f8;
                            (*p_Var48)(pRVar54);
                          }
                          auVar134._0_4_ = -(uint)((int)local_578 == 0);
                          auVar134._4_4_ = -(uint)(local_578._4_4_ == 0);
                          auVar134._8_4_ = -(uint)((int)uStack_570 == 0);
                          auVar134._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                          auVar108 = auVar134 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_4e0 + 0x80) =
                               ~auVar134 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_4e0 + 0x80) & auVar134;
                          pRVar47 = local_4e0;
                        }
                        auVar109._0_4_ = auVar108._0_4_ << 0x1f;
                        auVar109._4_4_ = auVar108._4_4_ << 0x1f;
                        auVar109._8_4_ = auVar108._8_4_ << 0x1f;
                        auVar109._12_4_ = auVar108._12_4_ << 0x1f;
                        iVar43 = movmskps((int)pRVar47,auVar109);
                        unaff_BPL = iVar43 != 0;
                        if (!(bool)unaff_BPL) {
                          *(float *)(ray + k * 4 + 0x80) = fVar68;
                        }
                      }
                      lVar46 = 0;
                      goto LAB_00b60d0c;
                    }
                  }
                  lVar46 = 0;
                  unaff_BPL = 0;
                }
LAB_00b60d0c:
                if ((char)lVar46 == '\0') goto LAB_00b6103a;
                lVar57 = lVar57 + -1;
              } while (lVar57 != 0);
              unaff_BPL = 0;
LAB_00b6103a:
              unaff_BPL = unaff_BPL & 1;
              fVar67 = *(float *)(ray + k * 4 + 0x80);
              local_3d8._0_4_ = -(uint)(local_488 <= fVar67) & local_3d8._0_4_;
              local_3d8._4_4_ = -(uint)(fStack_484 <= fVar67) & local_3d8._4_4_;
              local_3d8._8_4_ = -(uint)(fStack_480 <= fVar67) & local_3d8._8_4_;
              local_3d8._12_4_ = -(uint)(fStack_47c <= fVar67) & local_3d8._12_4_;
              bVar55 = bVar55 | unaff_BPL;
              uVar52 = (undefined4)((ulong)lVar46 >> 0x20);
              iVar43 = movmskps((int)lVar46,local_3d8);
            } while (iVar43 != 0);
          }
          fVar67 = *(float *)(ray + k * 4 + 0x80);
          auVar188._0_4_ =
               local_558._0_4_ & local_398._0_4_ &
               -(uint)(local_3f8 + (float)local_118._0_4_ <= fVar67);
          auVar188._4_4_ =
               local_558._4_4_ & local_398._4_4_ &
               -(uint)(fStack_3f4 + (float)local_118._4_4_ <= fVar67);
          auVar188._8_4_ =
               (uint)fStack_550 & (uint)fStack_390 & -(uint)(fStack_3f0 + fStack_110 <= fVar67);
          auVar188._12_4_ =
               (uint)fStack_54c & (uint)fStack_38c & -(uint)(fStack_3ec + fStack_10c <= fVar67);
          auVar153._0_4_ =
               auVar149._0_4_ & local_4b8._0_4_ &
               -(uint)(local_3f8 + (float)local_1a8._0_4_ <= fVar67);
          auVar153._4_4_ =
               auVar149._4_4_ & local_4b8._4_4_ &
               -(uint)(fStack_3f4 + (float)local_1a8._4_4_ <= fVar67);
          auVar153._8_4_ =
               auVar149._8_4_ & (uint)fStack_4b0 & -(uint)(fStack_3f0 + fStack_1a0 <= fVar67);
          auVar153._12_4_ =
               auVar149._12_4_ & (uint)fStack_4ac & -(uint)(fStack_3ec + fStack_19c <= fVar67);
          iVar43 = movmskps(iVar43,auVar153 | auVar188);
          lVar46 = CONCAT44(uVar52,iVar43);
          fVar114 = local_548;
          fVar67 = fStack_544;
          fVar68 = fStack_540;
          fVar113 = fStack_53c;
          if (iVar43 != 0) {
            lVar46 = uVar56 * 0x30;
            *(undefined1 (*) [16])(local_f8 + uVar56 * 0xc) = auVar153 | auVar188;
            afStack_e8[uVar56 * 0xc] =
                 (float)(~auVar188._0_4_ & local_1a8._0_4_ | local_118._0_4_ & auVar188._0_4_);
            afStack_e8[uVar56 * 0xc + 1] =
                 (float)(~auVar188._4_4_ & local_1a8._4_4_ | local_118._4_4_ & auVar188._4_4_);
            afStack_e8[uVar56 * 0xc + 2] =
                 (float)(~auVar188._8_4_ & (uint)fStack_1a0 | (uint)fStack_110 & auVar188._8_4_);
            afStack_e8[uVar56 * 0xc + 3] =
                 (float)(~auVar188._12_4_ & (uint)fStack_19c | (uint)fStack_10c & auVar188._12_4_);
            *(undefined8 *)(local_d8 + uVar56 * 0xc) = local_388;
            local_d8[uVar56 * 0xc + 2] = (float)((int)local_560 + 1);
            uVar56 = (ulong)((int)uVar56 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar56 == 0) {
        if (bVar55 != 0) {
          return local_6a9;
        }
        fVar156 = *(float *)(ray + k * 4 + 0x80);
        auVar138._4_4_ = -(uint)(fStack_184 <= fVar156);
        auVar138._0_4_ = -(uint)(local_188 <= fVar156);
        auVar138._8_4_ = -(uint)(fStack_180 <= fVar156);
        auVar138._12_4_ = -(uint)(fStack_17c <= fVar156);
        uVar58 = movmskps((int)lVar46,auVar138);
        uVar58 = (uint)local_410 & uVar58;
        local_6a9 = uVar58 != 0;
        if (!local_6a9) {
          return local_6a9;
        }
        goto LAB_00b5e592;
      }
      uVar50 = (ulong)((int)uVar56 - 1);
      fVar155 = *(float *)(ray + k * 4 + 0x80);
      auVar110._0_4_ =
           -(uint)(local_3f8 + afStack_e8[uVar50 * 0xc] <= fVar155) & local_f8[uVar50 * 0xc];
      auVar110._4_4_ =
           -(uint)(fStack_3f4 + afStack_e8[uVar50 * 0xc + 1] <= fVar155) &
           local_f8[uVar50 * 0xc + 1];
      auVar110._8_4_ =
           -(uint)(fStack_3f0 + afStack_e8[uVar50 * 0xc + 2] <= fVar155) &
           local_f8[uVar50 * 0xc + 2];
      auVar110._12_4_ =
           -(uint)(fStack_3ec + afStack_e8[uVar50 * 0xc + 3] <= fVar155) &
           (uint)afStack_e8[uVar50 * 0xc + -1];
      _local_238 = auVar110;
      iVar43 = movmskps((int)lVar46,auVar110);
      lVar46 = CONCAT44((int)((ulong)lVar46 >> 0x20),iVar43);
      if (iVar43 != 0) {
        auVar135._0_4_ = (uint)afStack_e8[uVar50 * 0xc] & auVar110._0_4_;
        auVar135._4_4_ = (uint)afStack_e8[uVar50 * 0xc + 1] & auVar110._4_4_;
        auVar135._8_4_ = (uint)afStack_e8[uVar50 * 0xc + 2] & auVar110._8_4_;
        auVar135._12_4_ = (uint)afStack_e8[uVar50 * 0xc + 3] & auVar110._12_4_;
        auVar154._0_8_ = CONCAT44(~auVar110._4_4_,~auVar110._0_4_) & 0x7f8000007f800000;
        auVar154._8_4_ = ~auVar110._8_4_ & 0x7f800000;
        auVar154._12_4_ = ~auVar110._12_4_ & 0x7f800000;
        auVar154 = auVar154 | auVar135;
        auVar168._4_4_ = auVar154._0_4_;
        auVar168._0_4_ = auVar154._4_4_;
        auVar168._8_4_ = auVar154._12_4_;
        auVar168._12_4_ = auVar154._8_4_;
        auVar77 = minps(auVar168,auVar154);
        auVar136._0_8_ = auVar77._8_8_;
        auVar136._8_4_ = auVar77._0_4_;
        auVar136._12_4_ = auVar77._4_4_;
        auVar77 = minps(auVar136,auVar77);
        auVar137._0_8_ =
             CONCAT44(-(uint)(auVar77._4_4_ == auVar154._4_4_) & auVar110._4_4_,
                      -(uint)(auVar77._0_4_ == auVar154._0_4_) & auVar110._0_4_);
        auVar137._8_4_ = -(uint)(auVar77._8_4_ == auVar154._8_4_) & auVar110._8_4_;
        auVar137._12_4_ = -(uint)(auVar77._12_4_ == auVar154._12_4_) & auVar110._12_4_;
        iVar51 = movmskps((int)p_Var53,auVar137);
        if (iVar51 != 0) {
          auVar110._8_4_ = auVar137._8_4_;
          auVar110._0_8_ = auVar137._0_8_;
          auVar110._12_4_ = auVar137._12_4_;
        }
        fVar155 = local_d8[uVar50 * 0xc];
        fVar157 = local_d8[uVar50 * 0xc + 1];
        uVar52 = movmskps(iVar51,auVar110);
        uVar45 = CONCAT44((int)((ulong)p_Var53 >> 0x20),uVar52);
        p_Var53 = (RTCFilterFunctionN)0x0;
        if (uVar45 != 0) {
          for (; (uVar45 >> (long)p_Var53 & 1) == 0; p_Var53 = p_Var53 + 1) {
          }
        }
        *(undefined4 *)(local_238 + (long)p_Var53 * 4) = 0;
        iVar51 = movmskps((int)pRVar54,_local_238);
        pRVar54 = (RTCFilterFunctionNArguments *)(ulong)(uint)local_d8[uVar50 * 0xc + 2];
        if (iVar51 == 0) {
          uVar56 = uVar50;
        }
        *(undefined1 (*) [16])(local_f8 + uVar50 * 0xc) = _local_238;
        fVar157 = fVar157 - fVar155;
        local_4f8._4_4_ = fVar157 * 0.33333334 + fVar155;
        local_4f8._0_4_ = fVar157 * 0.0 + fVar155;
        uStack_4f0 = (void *)CONCAT44(fVar157 * 1.0 + fVar155,fVar157 * 0.6666667 + fVar155);
        local_388 = *(undefined8 *)(local_4f8 + (long)p_Var53 * 4);
        uStack_380 = 0;
        uVar50 = uVar56;
        local_560 = pRVar54;
      }
      uVar56 = uVar50;
    } while ((char)iVar43 == '\0');
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }